

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  bool bVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [12];
  undefined1 auVar67 [32];
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  byte bVar79;
  long lVar80;
  uint uVar81;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ulong uVar82;
  undefined4 uVar83;
  ulong uVar84;
  byte unaff_R14B;
  float fVar85;
  undefined8 uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar106 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar114;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar133 [32];
  float fVar146;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar191 [16];
  undefined1 auVar195 [32];
  undefined4 uVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined4 uVar214;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar228 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 in_ZMM10 [64];
  undefined1 auVar236 [64];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar246;
  float fVar247;
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  float fVar248;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 in_ZMM12 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_b11;
  int local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined4 local_958;
  float local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  uint local_944;
  uint local_940;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  Primitive *local_750;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar249 [32];
  
  PVar6 = prim[1];
  uVar82 = (ulong)(byte)PVar6;
  fVar85 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar93 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar215._0_4_ = fVar85 * (ray->dir).field_0.m128[0];
  auVar215._4_4_ = fVar85 * (ray->dir).field_0.m128[1];
  auVar215._8_4_ = fVar85 * (ray->dir).field_0.m128[2];
  auVar215._12_4_ = fVar85 * (ray->dir).field_0.m128[3];
  auVar87._0_4_ = fVar85 * auVar93._0_4_;
  auVar87._4_4_ = fVar85 * auVar93._4_4_;
  auVar87._8_4_ = fVar85 * auVar93._8_4_;
  auVar87._12_4_ = fVar85 * auVar93._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar93);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar233 = vpmovsxbd_avx2(auVar190);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar219 = vpmovsxbd_avx2(auVar228);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar12 = vpmovsxbd_avx2(auVar121);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar13 = vpmovsxbd_avx2(auVar130);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar82 + 6);
  auVar157 = vpmovsxbd_avx2(auVar151);
  auVar157 = vcvtdq2ps_avx(auVar157);
  uVar84 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar183 = vpmovsxbd_avx2(auVar3);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar84 + uVar82 + 6);
  auVar99 = vpmovsxbd_avx2(auVar4);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar84 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar133 = vpmovsxbd_avx2(auVar5);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar255._4_4_ = auVar215._0_4_;
  auVar255._0_4_ = auVar215._0_4_;
  auVar255._8_4_ = auVar215._0_4_;
  auVar255._12_4_ = auVar215._0_4_;
  auVar255._16_4_ = auVar215._0_4_;
  auVar255._20_4_ = auVar215._0_4_;
  auVar255._24_4_ = auVar215._0_4_;
  auVar255._28_4_ = auVar215._0_4_;
  auVar93 = vmovshdup_avx(auVar215);
  uVar86 = auVar93._0_8_;
  auVar264._8_8_ = uVar86;
  auVar264._0_8_ = uVar86;
  auVar264._16_8_ = uVar86;
  auVar264._24_8_ = uVar86;
  auVar93 = vshufps_avx(auVar215,auVar215,0xaa);
  fVar85 = auVar93._0_4_;
  auVar234._0_4_ = fVar85 * auVar219._0_4_;
  fVar114 = auVar93._4_4_;
  auVar234._4_4_ = fVar114 * auVar219._4_4_;
  auVar234._8_4_ = fVar85 * auVar219._8_4_;
  auVar234._12_4_ = fVar114 * auVar219._12_4_;
  auVar234._16_4_ = fVar85 * auVar219._16_4_;
  auVar234._20_4_ = fVar114 * auVar219._20_4_;
  auVar234._28_36_ = in_ZMM12._28_36_;
  auVar234._24_4_ = fVar85 * auVar219._24_4_;
  auVar227._0_4_ = auVar157._0_4_ * fVar85;
  auVar227._4_4_ = auVar157._4_4_ * fVar114;
  auVar227._8_4_ = auVar157._8_4_ * fVar85;
  auVar227._12_4_ = auVar157._12_4_ * fVar114;
  auVar227._16_4_ = auVar157._16_4_ * fVar85;
  auVar227._20_4_ = auVar157._20_4_ * fVar114;
  auVar227._28_36_ = in_ZMM10._28_36_;
  auVar227._24_4_ = auVar157._24_4_ * fVar85;
  auVar223._0_4_ = auVar133._0_4_ * fVar85;
  auVar223._4_4_ = auVar133._4_4_ * fVar114;
  auVar223._8_4_ = auVar133._8_4_ * fVar85;
  auVar223._12_4_ = auVar133._12_4_ * fVar114;
  auVar223._16_4_ = auVar133._16_4_ * fVar85;
  auVar223._20_4_ = auVar133._20_4_ * fVar114;
  auVar223._24_4_ = auVar133._24_4_ * fVar85;
  auVar223._28_4_ = 0;
  auVar93 = vfmadd231ps_fma(auVar234._0_32_,auVar264,auVar233);
  auVar190 = vfmadd231ps_fma(auVar227._0_32_,auVar264,auVar13);
  auVar228 = vfmadd231ps_fma(auVar223,auVar99,auVar264);
  auVar121 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar255,auVar106);
  auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar255,auVar12);
  auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar183,auVar255);
  auVar256._4_4_ = auVar87._0_4_;
  auVar256._0_4_ = auVar87._0_4_;
  auVar256._8_4_ = auVar87._0_4_;
  auVar256._12_4_ = auVar87._0_4_;
  auVar256._16_4_ = auVar87._0_4_;
  auVar256._20_4_ = auVar87._0_4_;
  auVar256._24_4_ = auVar87._0_4_;
  auVar256._28_4_ = auVar87._0_4_;
  auVar93 = vmovshdup_avx(auVar87);
  uVar86 = auVar93._0_8_;
  auVar265._8_8_ = uVar86;
  auVar265._0_8_ = uVar86;
  auVar265._16_8_ = uVar86;
  auVar265._24_8_ = uVar86;
  auVar93 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar85 = auVar93._0_4_;
  auVar216._0_4_ = fVar85 * auVar219._0_4_;
  fVar114 = auVar93._4_4_;
  auVar216._4_4_ = fVar114 * auVar219._4_4_;
  auVar216._8_4_ = fVar85 * auVar219._8_4_;
  auVar216._12_4_ = fVar114 * auVar219._12_4_;
  auVar216._16_4_ = fVar85 * auVar219._16_4_;
  auVar216._20_4_ = fVar114 * auVar219._20_4_;
  auVar216._24_4_ = fVar85 * auVar219._24_4_;
  auVar216._28_4_ = 0;
  auVar14._4_4_ = auVar157._4_4_ * fVar114;
  auVar14._0_4_ = auVar157._0_4_ * fVar85;
  auVar14._8_4_ = auVar157._8_4_ * fVar85;
  auVar14._12_4_ = auVar157._12_4_ * fVar114;
  auVar14._16_4_ = auVar157._16_4_ * fVar85;
  auVar14._20_4_ = auVar157._20_4_ * fVar114;
  auVar14._24_4_ = auVar157._24_4_ * fVar85;
  auVar14._28_4_ = auVar219._28_4_;
  auVar219._4_4_ = auVar133._4_4_ * fVar114;
  auVar219._0_4_ = auVar133._0_4_ * fVar85;
  auVar219._8_4_ = auVar133._8_4_ * fVar85;
  auVar219._12_4_ = auVar133._12_4_ * fVar114;
  auVar219._16_4_ = auVar133._16_4_ * fVar85;
  auVar219._20_4_ = auVar133._20_4_ * fVar114;
  auVar219._24_4_ = auVar133._24_4_ * fVar85;
  auVar219._28_4_ = fVar114;
  auVar93 = vfmadd231ps_fma(auVar216,auVar265,auVar233);
  auVar130 = vfmadd231ps_fma(auVar14,auVar265,auVar13);
  auVar151 = vfmadd231ps_fma(auVar219,auVar265,auVar99);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar256,auVar106);
  local_740._8_4_ = 0x7fffffff;
  local_740._0_8_ = 0x7fffffff7fffffff;
  local_740._12_4_ = 0x7fffffff;
  local_740._16_4_ = 0x7fffffff;
  local_740._20_4_ = 0x7fffffff;
  local_740._24_4_ = 0x7fffffff;
  local_740._28_4_ = 0x7fffffff;
  auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar256,auVar12);
  auVar106 = vandps_avx(ZEXT1632(auVar121),local_740);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  auVar230._16_4_ = 0x219392ef;
  auVar230._20_4_ = 0x219392ef;
  auVar230._24_4_ = 0x219392ef;
  auVar230._28_4_ = 0x219392ef;
  auVar106 = vcmpps_avx(auVar106,auVar230,1);
  auVar233 = vblendvps_avx(ZEXT1632(auVar121),auVar230,auVar106);
  auVar106 = vandps_avx(ZEXT1632(auVar190),local_740);
  auVar106 = vcmpps_avx(auVar106,auVar230,1);
  auVar219 = vblendvps_avx(ZEXT1632(auVar190),auVar230,auVar106);
  auVar106 = vandps_avx(ZEXT1632(auVar228),local_740);
  auVar106 = vcmpps_avx(auVar106,auVar230,1);
  auVar12 = vrcpps_avx(auVar233);
  auVar106 = vblendvps_avx(ZEXT1632(auVar228),auVar230,auVar106);
  auVar224._8_4_ = 0x3f800000;
  auVar224._0_8_ = &DAT_3f8000003f800000;
  auVar224._12_4_ = 0x3f800000;
  auVar224._16_4_ = 0x3f800000;
  auVar224._20_4_ = 0x3f800000;
  auVar224._24_4_ = 0x3f800000;
  auVar224._28_4_ = 0x3f800000;
  auVar121 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar256,auVar183);
  auVar13 = vrcpps_avx(auVar219);
  auVar93 = vfnmadd213ps_fma(auVar233,auVar12,auVar224);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar12,auVar12);
  auVar190 = vfnmadd213ps_fma(auVar219,auVar13,auVar224);
  auVar190 = vfmadd132ps_fma(ZEXT1632(auVar190),auVar13,auVar13);
  auVar233 = vrcpps_avx(auVar106);
  auVar228 = vfnmadd213ps_fma(auVar106,auVar233,auVar224);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar228 = vfmadd132ps_fma(ZEXT1632(auVar228),auVar233,auVar233);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar3));
  auVar12._4_4_ = auVar93._4_4_ * auVar106._4_4_;
  auVar12._0_4_ = auVar93._0_4_ * auVar106._0_4_;
  auVar12._8_4_ = auVar93._8_4_ * auVar106._8_4_;
  auVar12._12_4_ = auVar93._12_4_ * auVar106._12_4_;
  auVar12._16_4_ = auVar106._16_4_ * 0.0;
  auVar12._20_4_ = auVar106._20_4_ * 0.0;
  auVar12._24_4_ = auVar106._24_4_ * 0.0;
  auVar12._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar3));
  auVar100._0_4_ = auVar93._0_4_ * auVar106._0_4_;
  auVar100._4_4_ = auVar93._4_4_ * auVar106._4_4_;
  auVar100._8_4_ = auVar93._8_4_ * auVar106._8_4_;
  auVar100._12_4_ = auVar93._12_4_ * auVar106._12_4_;
  auVar100._16_4_ = auVar106._16_4_ * 0.0;
  auVar100._20_4_ = auVar106._20_4_ * 0.0;
  auVar100._24_4_ = auVar106._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar6;
  auVar233 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar82 * -2 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar130));
  auVar13._4_4_ = auVar106._4_4_ * auVar190._4_4_;
  auVar13._0_4_ = auVar106._0_4_ * auVar190._0_4_;
  auVar13._8_4_ = auVar106._8_4_ * auVar190._8_4_;
  auVar13._12_4_ = auVar106._12_4_ * auVar190._12_4_;
  auVar13._16_4_ = auVar106._16_4_ * 0.0;
  auVar13._20_4_ = auVar106._20_4_ * 0.0;
  auVar13._24_4_ = auVar106._24_4_ * 0.0;
  auVar13._28_4_ = auVar106._28_4_;
  auVar106 = vcvtdq2ps_avx(auVar233);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar130));
  auVar157._4_4_ = auVar190._4_4_ * auVar106._4_4_;
  auVar157._0_4_ = auVar190._0_4_ * auVar106._0_4_;
  auVar157._8_4_ = auVar190._8_4_ * auVar106._8_4_;
  auVar157._12_4_ = auVar190._12_4_ * auVar106._12_4_;
  auVar157._16_4_ = auVar106._16_4_ * 0.0;
  auVar157._20_4_ = auVar106._20_4_ * 0.0;
  auVar157._24_4_ = auVar106._24_4_ * 0.0;
  auVar157._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 + uVar82 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar121));
  auVar183._4_4_ = auVar106._4_4_ * auVar228._4_4_;
  auVar183._0_4_ = auVar106._0_4_ * auVar228._0_4_;
  auVar183._8_4_ = auVar106._8_4_ * auVar228._8_4_;
  auVar183._12_4_ = auVar106._12_4_ * auVar228._12_4_;
  auVar183._16_4_ = auVar106._16_4_ * 0.0;
  auVar183._20_4_ = auVar106._20_4_ * 0.0;
  auVar183._24_4_ = auVar106._24_4_ * 0.0;
  auVar183._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar121));
  auVar99._4_4_ = auVar228._4_4_ * auVar106._4_4_;
  auVar99._0_4_ = auVar228._0_4_ * auVar106._0_4_;
  auVar99._8_4_ = auVar228._8_4_ * auVar106._8_4_;
  auVar99._12_4_ = auVar228._12_4_ * auVar106._12_4_;
  auVar99._16_4_ = auVar106._16_4_ * 0.0;
  auVar99._20_4_ = auVar106._20_4_ * 0.0;
  auVar99._24_4_ = auVar106._24_4_ * 0.0;
  auVar99._28_4_ = auVar106._28_4_;
  auVar106 = vpminsd_avx2(auVar12,auVar100);
  auVar233 = vpminsd_avx2(auVar13,auVar157);
  auVar106 = vmaxps_avx(auVar106,auVar233);
  auVar233 = vpminsd_avx2(auVar183,auVar99);
  uVar83 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar231._4_4_ = uVar83;
  auVar231._0_4_ = uVar83;
  auVar231._8_4_ = uVar83;
  auVar231._12_4_ = uVar83;
  auVar231._16_4_ = uVar83;
  auVar231._20_4_ = uVar83;
  auVar231._24_4_ = uVar83;
  auVar231._28_4_ = uVar83;
  auVar233 = vmaxps_avx(auVar233,auVar231);
  auVar106 = vmaxps_avx(auVar106,auVar233);
  local_300._4_4_ = auVar106._4_4_ * 0.99999964;
  local_300._0_4_ = auVar106._0_4_ * 0.99999964;
  local_300._8_4_ = auVar106._8_4_ * 0.99999964;
  local_300._12_4_ = auVar106._12_4_ * 0.99999964;
  local_300._16_4_ = auVar106._16_4_ * 0.99999964;
  local_300._20_4_ = auVar106._20_4_ * 0.99999964;
  local_300._24_4_ = auVar106._24_4_ * 0.99999964;
  local_300._28_4_ = 0x3f7ffffa;
  auVar106 = vpmaxsd_avx2(auVar12,auVar100);
  auVar233 = vpmaxsd_avx2(auVar13,auVar157);
  auVar106 = vminps_avx(auVar106,auVar233);
  auVar233 = vpmaxsd_avx2(auVar183,auVar99);
  fVar85 = ray->tfar;
  auVar97._4_4_ = fVar85;
  auVar97._0_4_ = fVar85;
  auVar97._8_4_ = fVar85;
  auVar97._12_4_ = fVar85;
  auVar97._16_4_ = fVar85;
  auVar97._20_4_ = fVar85;
  auVar97._24_4_ = fVar85;
  auVar97._28_4_ = fVar85;
  auVar233 = vminps_avx(auVar233,auVar97);
  auVar106 = vminps_avx(auVar106,auVar233);
  auVar233._4_4_ = auVar106._4_4_ * 1.0000004;
  auVar233._0_4_ = auVar106._0_4_ * 1.0000004;
  auVar233._8_4_ = auVar106._8_4_ * 1.0000004;
  auVar233._12_4_ = auVar106._12_4_ * 1.0000004;
  auVar233._16_4_ = auVar106._16_4_ * 1.0000004;
  auVar233._20_4_ = auVar106._20_4_ * 1.0000004;
  auVar233._24_4_ = auVar106._24_4_ * 1.0000004;
  auVar233._28_4_ = auVar106._28_4_;
  auVar133[4] = PVar6;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar6;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar6;
  auVar133._13_3_ = 0;
  auVar133[0x10] = PVar6;
  auVar133._17_3_ = 0;
  auVar133[0x14] = PVar6;
  auVar133._21_3_ = 0;
  auVar133[0x18] = PVar6;
  auVar133._25_3_ = 0;
  auVar133[0x1c] = PVar6;
  auVar133._29_3_ = 0;
  auVar106 = vcmpps_avx(local_300,auVar233,2);
  auVar233 = vpcmpgtd_avx2(auVar133,_DAT_0205a920);
  auVar106 = vandps_avx(auVar106,auVar233);
  uVar78 = vmovmskps_avx(auVar106);
  local_b11 = uVar78 != 0;
  if (uVar78 == 0) {
    return local_b11;
  }
  uVar78 = uVar78 & 0xff;
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  local_750 = prim;
LAB_018bf164:
  lVar80 = 0;
  local_748 = (ulong)uVar78;
  for (uVar84 = local_748; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  local_a88 = (ulong)*(uint *)(local_750 + 2);
  local_928 = (ulong)*(uint *)(local_750 + lVar80 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[local_a88].ptr;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_928);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar7[1].time_range.upper;
  auVar93 = *(undefined1 (*) [16])(lVar80 + (long)p_Var8 * uVar84);
  auVar190 = *(undefined1 (*) [16])(lVar80 + (uVar84 + 1) * (long)p_Var8);
  auVar228 = *(undefined1 (*) [16])(lVar80 + (uVar84 + 2) * (long)p_Var8);
  local_748 = local_748 - 1 & local_748;
  auVar121 = *(undefined1 (*) [16])(lVar80 + (uVar84 + 3) * (long)p_Var8);
  if (local_748 != 0) {
    uVar82 = local_748 - 1 & local_748;
    for (uVar84 = local_748; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    }
    if (uVar82 != 0) {
      for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar202._0_4_ = (auVar93._0_4_ + auVar190._0_4_ + auVar228._0_4_ + auVar121._0_4_) * 0.25;
  auVar202._4_4_ = (auVar93._4_4_ + auVar190._4_4_ + auVar228._4_4_ + auVar121._4_4_) * 0.25;
  auVar202._8_4_ = (auVar93._8_4_ + auVar190._8_4_ + auVar228._8_4_ + auVar121._8_4_) * 0.25;
  auVar202._12_4_ = (auVar93._12_4_ + auVar190._12_4_ + auVar228._12_4_ + auVar121._12_4_) * 0.25;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar130 = vsubps_avx(auVar202,(undefined1  [16])aVar1);
  auVar130 = vdpps_avx(auVar130,(undefined1  [16])aVar2,0x7f);
  auVar151 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar3 = vrcpss_avx(auVar151,auVar151);
  auVar151 = vfnmadd213ss_fma(auVar3,auVar151,ZEXT416(0x40000000));
  auVar234 = ZEXT1664(auVar151);
  fVar85 = auVar130._0_4_ * auVar3._0_4_ * auVar151._0_4_;
  local_770 = ZEXT416((uint)fVar85);
  auVar203._4_4_ = fVar85;
  auVar203._0_4_ = fVar85;
  auVar203._8_4_ = fVar85;
  auVar203._12_4_ = fVar85;
  fStack_810 = fVar85;
  _local_820 = auVar203;
  fStack_80c = fVar85;
  fStack_808 = fVar85;
  fStack_804 = fVar85;
  auVar130 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar203);
  auVar130 = vblendps_avx(auVar130,_DAT_01feba10,8);
  local_a20 = vsubps_avx(auVar93,auVar130);
  local_a30 = vsubps_avx(auVar228,auVar130);
  local_a40 = vsubps_avx(auVar190,auVar130);
  _local_a50 = vsubps_avx(auVar121,auVar130);
  auVar93 = vmovshdup_avx(local_a20);
  local_1c0 = auVar93._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar93 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar86 = auVar93._0_8_;
  local_1a0._8_8_ = uVar86;
  local_1a0._0_8_ = uVar86;
  local_1a0._16_8_ = uVar86;
  local_1a0._24_8_ = uVar86;
  auVar93 = vshufps_avx(local_a20,local_a20,0xff);
  uVar86 = auVar93._0_8_;
  local_480._8_8_ = uVar86;
  local_480._0_8_ = uVar86;
  local_480._16_8_ = uVar86;
  local_480._24_8_ = uVar86;
  auVar93 = vmovshdup_avx(local_a40);
  uVar86 = auVar93._0_8_;
  auVar243._8_8_ = uVar86;
  auVar243._0_8_ = uVar86;
  auVar243._16_8_ = uVar86;
  auVar243._24_8_ = uVar86;
  auVar93 = vshufps_avx(local_a40,local_a40,0xaa);
  uVar86 = auVar93._0_8_;
  local_9a0._8_8_ = uVar86;
  local_9a0._0_8_ = uVar86;
  local_9a0._16_8_ = uVar86;
  local_9a0._24_8_ = uVar86;
  auVar93 = vshufps_avx(local_a40,local_a40,0xff);
  local_1e0 = auVar93._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar93 = vmovshdup_avx(local_a30);
  uVar86 = auVar93._0_8_;
  local_2a0._8_8_ = uVar86;
  local_2a0._0_8_ = uVar86;
  local_2a0._16_8_ = uVar86;
  local_2a0._24_8_ = uVar86;
  auVar93 = vshufps_avx(local_a30,local_a30,0xaa);
  local_360 = auVar93._0_4_;
  fStack_35c = auVar93._4_4_;
  auVar93 = vshufps_avx(local_a30,local_a30,0xff);
  local_380 = auVar93._0_4_;
  fStack_37c = auVar93._4_4_;
  auVar93 = vmovshdup_avx(_local_a50);
  local_200 = auVar93._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar93 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_220 = auVar93._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar93 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_240 = auVar93._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar88._0_4_ = aVar2.x * aVar2.x;
  auVar88._4_4_ = aVar2.y * aVar2.y;
  auVar88._8_4_ = aVar2.z * aVar2.z;
  auVar88._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar93 = vshufps_avx(auVar88,auVar88,0xaa);
  uVar83 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_6e0._4_4_ = uVar83;
  local_6e0._0_4_ = uVar83;
  fStack_6d8 = (float)uVar83;
  fStack_6d4 = (float)uVar83;
  fStack_6d0 = (float)uVar83;
  fStack_6cc = (float)uVar83;
  fStack_6c8 = (float)uVar83;
  register0x000014dc = uVar83;
  auVar244 = ZEXT3264(_local_6e0);
  auVar96._0_8_ = auVar93._0_8_;
  auVar96._8_8_ = auVar96._0_8_;
  auVar96._16_8_ = auVar96._0_8_;
  auVar96._24_8_ = auVar96._0_8_;
  auVar93 = vfmadd231ps_fma(auVar96,_local_6e0,_local_6e0);
  uVar83 = *(undefined4 *)&(ray->dir).field_0;
  local_4a0._4_4_ = uVar83;
  local_4a0._0_4_ = uVar83;
  fStack_498 = (float)uVar83;
  fStack_494 = (float)uVar83;
  fStack_490 = (float)uVar83;
  fStack_48c = (float)uVar83;
  fStack_488 = (float)uVar83;
  register0x0000141c = uVar83;
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_4a0,_local_4a0);
  uVar84 = 1;
  uVar82 = 0;
  bVar79 = 0;
  local_4c0 = (ray->dir).field_0.m128[2];
  uVar83 = local_a20._0_4_;
  local_9e0._4_4_ = uVar83;
  local_9e0._0_4_ = uVar83;
  local_9e0._8_4_ = uVar83;
  local_9e0._12_4_ = uVar83;
  local_9e0._16_4_ = uVar83;
  local_9e0._20_4_ = uVar83;
  local_9e0._24_4_ = uVar83;
  local_9e0._28_4_ = uVar83;
  auVar227 = ZEXT3264(local_9e0);
  uVar83 = local_a40._0_4_;
  local_860._4_4_ = uVar83;
  local_860._0_4_ = uVar83;
  local_860._8_4_ = uVar83;
  local_860._12_4_ = uVar83;
  local_860._16_4_ = uVar83;
  local_860._20_4_ = uVar83;
  local_860._24_4_ = uVar83;
  local_860._28_4_ = uVar83;
  auVar236 = ZEXT3264(local_860);
  uVar83 = local_a30._0_4_;
  local_2c0._4_4_ = uVar83;
  local_2c0._0_4_ = uVar83;
  local_2c0._8_4_ = uVar83;
  local_2c0._12_4_ = uVar83;
  local_2c0._16_4_ = uVar83;
  local_2c0._20_4_ = uVar83;
  local_2c0._24_4_ = uVar83;
  local_2c0._28_4_ = uVar83;
  local_2e0 = local_a50._0_4_;
  local_260 = ZEXT1632(auVar93);
  local_3a0 = vandps_avx(ZEXT1632(auVar93),local_740);
  local_760 = ZEXT816(0x3f80000000000000);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_980 = auVar243;
  fStack_4bc = local_4c0;
  fStack_4b8 = local_4c0;
  fStack_4b4 = local_4c0;
  fStack_4b0 = local_4c0;
  fStack_4ac = local_4c0;
  fStack_4a8 = local_4c0;
  fStack_4a4 = local_4c0;
  fStack_378 = local_380;
  fStack_374 = fStack_37c;
  fStack_370 = local_380;
  fStack_36c = fStack_37c;
  fStack_368 = local_380;
  fStack_364 = fStack_37c;
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  do {
    auVar93 = vmovshdup_avx(local_760);
    local_800._0_4_ = local_760._0_4_;
    fVar145 = auVar93._0_4_ - (float)local_800._0_4_;
    fVar149 = fVar145 * 0.04761905;
    local_800._4_4_ = (float)local_800._0_4_;
    local_800._8_4_ = (float)local_800._0_4_;
    local_800._12_4_ = (float)local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    local_880._4_4_ = fVar145;
    local_880._0_4_ = fVar145;
    local_880._8_4_ = fVar145;
    local_880._12_4_ = fVar145;
    local_880._16_4_ = fVar145;
    local_880._20_4_ = fVar145;
    local_880._24_4_ = fVar145;
    local_880._28_4_ = fVar145;
    auVar93 = vfmadd231ps_fma(local_800,local_880,_DAT_02020f20);
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = &DAT_3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar106 = vsubps_avx(auVar266,ZEXT1632(auVar93));
    fVar85 = auVar93._0_4_;
    auVar245._0_4_ = auVar236._0_4_ * fVar85;
    fVar114 = auVar93._4_4_;
    auVar245._4_4_ = auVar236._4_4_ * fVar114;
    fVar144 = auVar93._8_4_;
    auVar245._8_4_ = auVar236._8_4_ * fVar144;
    fVar270 = auVar93._12_4_;
    auVar245._12_4_ = auVar236._12_4_ * fVar270;
    auVar245._16_4_ = auVar236._16_4_ * 0.0;
    auVar245._20_4_ = auVar236._20_4_ * 0.0;
    auVar245._28_36_ = auVar244._28_36_;
    auVar245._24_4_ = auVar236._24_4_ * 0.0;
    auVar260._0_4_ = auVar243._0_4_ * fVar85;
    auVar260._4_4_ = auVar243._4_4_ * fVar114;
    auVar260._8_4_ = auVar243._8_4_ * fVar144;
    auVar260._12_4_ = auVar243._12_4_ * fVar270;
    auVar260._16_4_ = auVar243._16_4_ * 0.0;
    auVar260._20_4_ = auVar243._20_4_ * 0.0;
    auVar260._28_36_ = auVar234._28_36_;
    auVar260._24_4_ = auVar243._24_4_ * 0.0;
    auVar16._4_4_ = local_9a0._4_4_ * fVar114;
    auVar16._0_4_ = local_9a0._0_4_ * fVar85;
    auVar16._8_4_ = local_9a0._8_4_ * fVar144;
    auVar16._12_4_ = local_9a0._12_4_ * fVar270;
    auVar16._16_4_ = local_9a0._16_4_ * 0.0;
    auVar16._20_4_ = local_9a0._20_4_ * 0.0;
    auVar16._24_4_ = local_9a0._24_4_ * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar76._8_8_ = uStack_1d8;
    auVar76._0_8_ = local_1e0;
    auVar76._16_8_ = uStack_1d0;
    auVar76._24_8_ = uStack_1c8;
    auVar17._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar114;
    auVar17._0_4_ = (float)local_1e0 * fVar85;
    auVar17._8_4_ = (float)uStack_1d8 * fVar144;
    auVar17._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar270;
    auVar17._16_4_ = (float)uStack_1d0 * 0.0;
    auVar17._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar17._24_4_ = (float)uStack_1c8 * 0.0;
    auVar17._28_4_ = fVar145;
    auVar93 = vfmadd231ps_fma(auVar245._0_32_,auVar106,auVar227._0_32_);
    auVar77._8_8_ = uStack_1b8;
    auVar77._0_8_ = local_1c0;
    auVar77._16_8_ = uStack_1b0;
    auVar77._24_8_ = uStack_1a8;
    auVar190 = vfmadd231ps_fma(auVar260._0_32_,auVar106,auVar77);
    auVar228 = vfmadd231ps_fma(auVar16,auVar106,local_1a0);
    auVar121 = vfmadd231ps_fma(auVar17,auVar106,local_480);
    auVar244._0_4_ = local_2c0._0_4_ * fVar85;
    auVar244._4_4_ = local_2c0._4_4_ * fVar114;
    auVar244._8_4_ = local_2c0._8_4_ * fVar144;
    auVar244._12_4_ = local_2c0._12_4_ * fVar270;
    auVar244._16_4_ = local_2c0._16_4_ * 0.0;
    auVar244._20_4_ = local_2c0._20_4_ * 0.0;
    auVar244._28_36_ = auVar227._28_36_;
    auVar244._24_4_ = local_2c0._24_4_ * 0.0;
    auVar18._4_4_ = local_2a0._4_4_ * fVar114;
    auVar18._0_4_ = local_2a0._0_4_ * fVar85;
    auVar18._8_4_ = local_2a0._8_4_ * fVar144;
    auVar18._12_4_ = local_2a0._12_4_ * fVar270;
    auVar18._16_4_ = local_2a0._16_4_ * 0.0;
    auVar18._20_4_ = local_2a0._20_4_ * 0.0;
    auVar18._24_4_ = local_2a0._24_4_ * 0.0;
    auVar18._28_4_ = local_2c0._28_4_;
    auVar67._4_4_ = fVar114 * fStack_35c;
    auVar67._0_4_ = fVar85 * local_360;
    auVar67._8_4_ = fVar144 * fStack_358;
    auVar67._12_4_ = fVar270 * fStack_354;
    auVar67._16_4_ = fStack_350 * 0.0;
    auVar67._20_4_ = fStack_34c * 0.0;
    auVar67._24_4_ = fStack_348 * 0.0;
    auVar67._28_4_ = local_480._28_4_;
    auVar65._4_4_ = fVar114 * fStack_37c;
    auVar65._0_4_ = fVar85 * local_380;
    auVar65._8_4_ = fVar144 * fStack_378;
    auVar65._12_4_ = fVar270 * fStack_374;
    auVar65._16_4_ = fStack_370 * 0.0;
    auVar65._20_4_ = fStack_36c * 0.0;
    auVar65._24_4_ = fStack_368 * 0.0;
    auVar65._28_4_ = local_1a0._28_4_;
    auVar130 = vfmadd231ps_fma(auVar244._0_32_,auVar106,auVar236._0_32_);
    auVar151 = vfmadd231ps_fma(auVar18,auVar106,auVar243);
    auVar3 = vfmadd231ps_fma(auVar67,auVar106,local_9a0);
    auVar4 = vfmadd231ps_fma(auVar65,auVar106,auVar76);
    auVar19._4_4_ = fStack_2dc * fVar114;
    auVar19._0_4_ = local_2e0 * fVar85;
    auVar19._8_4_ = fStack_2d8 * fVar144;
    auVar19._12_4_ = fStack_2d4 * fVar270;
    auVar19._16_4_ = fStack_2d0 * 0.0;
    auVar19._20_4_ = fStack_2cc * 0.0;
    auVar19._24_4_ = fStack_2c8 * 0.0;
    auVar19._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar20._4_4_ = fVar114 * local_200._4_4_;
    auVar20._0_4_ = fVar85 * (float)local_200;
    auVar20._8_4_ = fVar144 * (float)uStack_1f8;
    auVar20._12_4_ = fVar270 * uStack_1f8._4_4_;
    auVar20._16_4_ = (float)uStack_1f0 * 0.0;
    auVar20._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar20._24_4_ = (float)uStack_1e8 * 0.0;
    auVar20._28_4_ = auVar243._28_4_;
    auVar21._28_4_ = fStack_2c4;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar130._12_4_ * fVar270,
                            CONCAT48(auVar130._8_4_ * fVar144,
                                     CONCAT44(auVar130._4_4_ * fVar114,auVar130._0_4_ * fVar85))));
    auVar93 = vfmadd231ps_fma(auVar21,auVar106,ZEXT1632(auVar93));
    auVar190 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar270 * auVar151._12_4_,
                                                  CONCAT48(fVar144 * auVar151._8_4_,
                                                           CONCAT44(fVar114 * auVar151._4_4_,
                                                                    fVar85 * auVar151._0_4_)))),
                               auVar106,ZEXT1632(auVar190));
    auVar236._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * auVar3._12_4_,
                            CONCAT48(fVar144 * auVar3._8_4_,
                                     CONCAT44(fVar114 * auVar3._4_4_,fVar85 * auVar3._0_4_))));
    auVar228 = vfmadd231ps_fma(auVar236._0_32_,auVar106,ZEXT1632(auVar228));
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar270 * auVar4._12_4_,
                                                  CONCAT48(fVar144 * auVar4._8_4_,
                                                           CONCAT44(fVar114 * auVar4._4_4_,
                                                                    fVar85 * auVar4._0_4_)))),
                               auVar106,ZEXT1632(auVar121));
    auVar22._4_4_ = fVar114 * local_220._4_4_;
    auVar22._0_4_ = fVar85 * (float)local_220;
    auVar22._8_4_ = fVar144 * (float)uStack_218;
    auVar22._12_4_ = fVar270 * uStack_218._4_4_;
    auVar22._16_4_ = (float)uStack_210 * 0.0;
    auVar22._20_4_ = uStack_210._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_208 * 0.0;
    auVar22._28_4_ = local_9a0._28_4_;
    auVar5 = vfmadd231ps_fma(auVar19,auVar106,local_2c0);
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar270,
                                                  CONCAT48(auVar5._8_4_ * fVar144,
                                                           CONCAT44(auVar5._4_4_ * fVar114,
                                                                    auVar5._0_4_ * fVar85)))),
                               auVar106,ZEXT1632(auVar130));
    auVar225._0_4_ = fVar85 * (float)local_240;
    auVar225._4_4_ = fVar114 * local_240._4_4_;
    auVar225._8_4_ = fVar144 * (float)uStack_238;
    auVar225._12_4_ = fVar270 * uStack_238._4_4_;
    auVar225._16_4_ = (float)uStack_230 * 0.0;
    auVar225._20_4_ = uStack_230._4_4_ * 0.0;
    auVar225._24_4_ = (float)uStack_228 * 0.0;
    auVar225._28_4_ = 0;
    auVar5 = vfmadd231ps_fma(auVar20,auVar106,local_2a0);
    auVar75._4_4_ = fStack_35c;
    auVar75._0_4_ = local_360;
    auVar75._8_4_ = fStack_358;
    auVar75._12_4_ = fStack_354;
    auVar75._16_4_ = fStack_350;
    auVar75._20_4_ = fStack_34c;
    auVar75._24_4_ = fStack_348;
    auVar75._28_4_ = fStack_344;
    auVar87 = vfmadd231ps_fma(auVar22,auVar106,auVar75);
    auVar74._4_4_ = fStack_37c;
    auVar74._0_4_ = local_380;
    auVar74._8_4_ = fStack_378;
    auVar74._12_4_ = fStack_374;
    auVar74._16_4_ = fStack_370;
    auVar74._20_4_ = fStack_36c;
    auVar74._24_4_ = fStack_368;
    auVar74._28_4_ = fStack_364;
    auVar215 = vfmadd231ps_fma(auVar225,auVar106,auVar74);
    auVar23._28_4_ = local_2a0._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar215._12_4_ * fVar270,
                            CONCAT48(auVar215._8_4_ * fVar144,
                                     CONCAT44(auVar215._4_4_ * fVar114,auVar215._0_4_ * fVar85))));
    auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar270,
                                                  CONCAT48(auVar5._8_4_ * fVar144,
                                                           CONCAT44(auVar5._4_4_ * fVar114,
                                                                    auVar5._0_4_ * fVar85)))),
                               auVar106,ZEXT1632(auVar151));
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar270 * auVar87._12_4_,
                                                CONCAT48(fVar144 * auVar87._8_4_,
                                                         CONCAT44(fVar114 * auVar87._4_4_,
                                                                  fVar85 * auVar87._0_4_)))),
                             auVar106,ZEXT1632(auVar3));
    auVar4 = vfmadd231ps_fma(auVar23,auVar106,ZEXT1632(auVar4));
    auVar24._28_4_ = local_2c0._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar151._12_4_ * fVar270,
                            CONCAT48(auVar151._8_4_ * fVar144,
                                     CONCAT44(auVar151._4_4_ * fVar114,auVar151._0_4_ * fVar85))));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar270,
                                                CONCAT48(auVar130._8_4_ * fVar144,
                                                         CONCAT44(auVar130._4_4_ * fVar114,
                                                                  auVar130._0_4_ * fVar85)))),
                             auVar106,ZEXT1632(auVar93));
    auVar87 = vfmadd231ps_fma(auVar24,auVar106,ZEXT1632(auVar190));
    auVar97 = ZEXT1632(auVar87);
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar270 * auVar3._12_4_,
                                                 CONCAT48(fVar144 * auVar3._8_4_,
                                                          CONCAT44(fVar114 * auVar3._4_4_,
                                                                   fVar85 * auVar3._0_4_)))),
                              auVar106,ZEXT1632(auVar228));
    auVar215 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar270,
                                                  CONCAT48(auVar4._8_4_ * fVar144,
                                                           CONCAT44(auVar4._4_4_ * fVar114,
                                                                    auVar4._0_4_ * fVar85)))),
                               ZEXT1632(auVar121),auVar106);
    auVar233 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar93));
    auVar106 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar190));
    auVar219 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar228));
    auVar12 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar121));
    local_7e0._0_4_ = fVar149 * auVar233._0_4_ * 3.0;
    local_7e0._4_4_ = fVar149 * auVar233._4_4_ * 3.0;
    fStack_7d8 = fVar149 * auVar233._8_4_ * 3.0;
    fStack_7d4 = fVar149 * auVar233._12_4_ * 3.0;
    register0x00001550 = fVar149 * auVar233._16_4_ * 3.0;
    register0x00001554 = fVar149 * auVar233._20_4_ * 3.0;
    register0x00001558 = fVar149 * auVar233._24_4_ * 3.0;
    register0x0000155c = 0;
    local_9c0._0_4_ = fVar149 * auVar106._0_4_ * 3.0;
    local_9c0._4_4_ = fVar149 * auVar106._4_4_ * 3.0;
    local_9c0._8_4_ = fVar149 * auVar106._8_4_ * 3.0;
    local_9c0._12_4_ = fVar149 * auVar106._12_4_ * 3.0;
    local_9c0._16_4_ = fVar149 * auVar106._16_4_ * 3.0;
    local_9c0._20_4_ = fVar149 * auVar106._20_4_ * 3.0;
    local_9c0._24_4_ = fVar149 * auVar106._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    local_620._0_4_ = fVar149 * auVar219._0_4_ * 3.0;
    local_620._4_4_ = fVar149 * auVar219._4_4_ * 3.0;
    local_620._8_4_ = fVar149 * auVar219._8_4_ * 3.0;
    local_620._12_4_ = fVar149 * auVar219._12_4_ * 3.0;
    local_620._16_4_ = fVar149 * auVar219._16_4_ * 3.0;
    local_620._20_4_ = fVar149 * auVar219._20_4_ * 3.0;
    local_620._24_4_ = fVar149 * auVar219._24_4_ * 3.0;
    local_620._28_4_ = 0;
    fVar114 = fVar149 * auVar12._0_4_ * 3.0;
    fVar144 = fVar149 * auVar12._4_4_ * 3.0;
    auVar25._4_4_ = fVar144;
    auVar25._0_4_ = fVar114;
    fVar145 = fVar149 * auVar12._8_4_ * 3.0;
    auVar25._8_4_ = fVar145;
    fVar146 = fVar149 * auVar12._12_4_ * 3.0;
    auVar25._12_4_ = fVar146;
    fVar147 = fVar149 * auVar12._16_4_ * 3.0;
    auVar25._16_4_ = fVar147;
    fVar148 = fVar149 * auVar12._20_4_ * 3.0;
    auVar25._20_4_ = fVar148;
    fVar149 = fVar149 * auVar12._24_4_ * 3.0;
    auVar25._24_4_ = fVar149;
    auVar25._28_4_ = auVar233._28_4_;
    local_ac0 = ZEXT1632(auVar5);
    auVar14 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar5));
    local_7a0 = vpermps_avx2(_DAT_0205d4a0,auVar97);
    local_7c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar87));
    auVar13 = vsubps_avx(auVar14,local_ac0);
    auVar157 = vsubps_avx(local_7c0,ZEXT1632(auVar87));
    fVar162 = auVar157._0_4_;
    fVar163 = auVar157._4_4_;
    auVar26._4_4_ = fVar163 * (float)local_7e0._4_4_;
    auVar26._0_4_ = fVar162 * (float)local_7e0._0_4_;
    fVar164 = auVar157._8_4_;
    auVar26._8_4_ = fVar164 * fStack_7d8;
    fVar165 = auVar157._12_4_;
    auVar26._12_4_ = fVar165 * fStack_7d4;
    fVar200 = auVar157._16_4_;
    auVar26._16_4_ = fVar200 * register0x00001550;
    fVar201 = auVar157._20_4_;
    auVar26._20_4_ = fVar201 * register0x00001554;
    fVar235 = auVar157._24_4_;
    auVar26._24_4_ = fVar235 * register0x00001558;
    auVar26._28_4_ = local_7c0._28_4_;
    auVar93 = vfmsub231ps_fma(auVar26,local_620,auVar13);
    auVar183 = vsubps_avx(local_7a0,auVar97);
    fVar237 = auVar13._0_4_;
    fVar238 = auVar13._4_4_;
    auVar27._4_4_ = fVar238 * local_9c0._4_4_;
    auVar27._0_4_ = fVar237 * local_9c0._0_4_;
    fVar239 = auVar13._8_4_;
    auVar27._8_4_ = fVar239 * local_9c0._8_4_;
    fVar248 = auVar13._12_4_;
    auVar27._12_4_ = fVar248 * local_9c0._12_4_;
    fVar252 = auVar13._16_4_;
    auVar27._16_4_ = fVar252 * local_9c0._16_4_;
    fVar246 = auVar13._20_4_;
    auVar27._20_4_ = fVar246 * local_9c0._20_4_;
    fVar247 = auVar13._24_4_;
    auVar27._24_4_ = fVar247 * local_9c0._24_4_;
    auVar27._28_4_ = auVar14._28_4_;
    auVar190 = vfmsub231ps_fma(auVar27,_local_7e0,auVar183);
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                                 CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                                          CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                                   auVar190._0_4_ * auVar190._0_4_))
                                                )),ZEXT1632(auVar93),ZEXT1632(auVar93));
    fVar186 = auVar183._0_4_;
    fVar196 = auVar183._4_4_;
    auVar28._4_4_ = fVar196 * local_620._4_4_;
    auVar28._0_4_ = fVar186 * local_620._0_4_;
    fVar197 = auVar183._8_4_;
    auVar28._8_4_ = fVar197 * local_620._8_4_;
    fVar198 = auVar183._12_4_;
    auVar28._12_4_ = fVar198 * local_620._12_4_;
    fVar199 = auVar183._16_4_;
    auVar28._16_4_ = fVar199 * local_620._16_4_;
    fVar253 = auVar183._20_4_;
    auVar28._20_4_ = fVar253 * local_620._20_4_;
    fVar254 = auVar183._24_4_;
    auVar28._24_4_ = fVar254 * local_620._24_4_;
    auVar28._28_4_ = local_7a0._28_4_;
    auVar228 = vfmsub231ps_fma(auVar28,local_9c0,auVar157);
    auVar180._0_4_ = fVar162 * fVar162;
    auVar180._4_4_ = fVar163 * fVar163;
    auVar180._8_4_ = fVar164 * fVar164;
    auVar180._12_4_ = fVar165 * fVar165;
    auVar180._16_4_ = fVar200 * fVar200;
    auVar180._20_4_ = fVar201 * fVar201;
    auVar180._24_4_ = fVar235 * fVar235;
    auVar180._28_4_ = 0;
    auVar190 = vfmadd231ps_fma(auVar180,auVar183,auVar183);
    auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar13,auVar13);
    auVar106 = vrcpps_avx(ZEXT1632(auVar190));
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar228),ZEXT1632(auVar228));
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = &DAT_3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar232._16_4_ = 0x3f800000;
    auVar232._20_4_ = 0x3f800000;
    auVar232._24_4_ = 0x3f800000;
    auVar232._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar190),auVar232);
    auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar106,auVar106);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,_local_7e0);
    local_900 = vpermps_avx2(_DAT_0205d4a0,local_620);
    auVar29._4_4_ = fVar163 * local_a80._4_4_;
    auVar29._0_4_ = fVar162 * local_a80._0_4_;
    auVar29._8_4_ = fVar164 * local_a80._8_4_;
    auVar29._12_4_ = fVar165 * local_a80._12_4_;
    auVar29._16_4_ = fVar200 * local_a80._16_4_;
    auVar29._20_4_ = fVar201 * local_a80._20_4_;
    auVar29._24_4_ = fVar235 * local_a80._24_4_;
    auVar29._28_4_ = auVar106._28_4_;
    auVar121 = vfmsub231ps_fma(auVar29,local_900,auVar13);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_9c0);
    auVar30._4_4_ = fVar238 * local_920._4_4_;
    auVar30._0_4_ = fVar237 * local_920._0_4_;
    auVar30._8_4_ = fVar239 * local_920._8_4_;
    auVar30._12_4_ = fVar248 * local_920._12_4_;
    auVar30._16_4_ = fVar252 * local_920._16_4_;
    auVar30._20_4_ = fVar246 * local_920._20_4_;
    auVar30._24_4_ = fVar247 * local_920._24_4_;
    auVar30._28_4_ = 0;
    auVar130 = vfmsub231ps_fma(auVar30,local_a80,auVar183);
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * auVar130._12_4_,
                                                  CONCAT48(auVar130._8_4_ * auVar130._8_4_,
                                                           CONCAT44(auVar130._4_4_ * auVar130._4_4_,
                                                                    auVar130._0_4_ * auVar130._0_4_)
                                                          ))),ZEXT1632(auVar121),ZEXT1632(auVar121))
    ;
    fVar85 = local_900._0_4_;
    auVar208._0_4_ = fVar186 * fVar85;
    fVar270 = local_900._4_4_;
    auVar208._4_4_ = fVar196 * fVar270;
    fVar271 = local_900._8_4_;
    auVar208._8_4_ = fVar197 * fVar271;
    fVar272 = local_900._12_4_;
    auVar208._12_4_ = fVar198 * fVar272;
    fVar9 = local_900._16_4_;
    auVar208._16_4_ = fVar199 * fVar9;
    fVar10 = local_900._20_4_;
    auVar208._20_4_ = fVar253 * fVar10;
    fVar11 = local_900._24_4_;
    auVar208._24_4_ = fVar254 * fVar11;
    auVar208._28_4_ = 0;
    auVar130 = vfmsub231ps_fma(auVar208,local_920,auVar157);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),ZEXT1632(auVar130),ZEXT1632(auVar130));
    auVar106 = vmaxps_avx(ZEXT1632(CONCAT412(auVar228._12_4_ * auVar93._12_4_,
                                             CONCAT48(auVar228._8_4_ * auVar93._8_4_,
                                                      CONCAT44(auVar228._4_4_ * auVar93._4_4_,
                                                               auVar228._0_4_ * auVar93._0_4_)))),
                          ZEXT1632(CONCAT412(auVar121._12_4_ * auVar93._12_4_,
                                             CONCAT48(auVar121._8_4_ * auVar93._8_4_,
                                                      CONCAT44(auVar121._4_4_ * auVar93._4_4_,
                                                               auVar121._0_4_ * auVar93._0_4_)))));
    local_8c0._0_4_ = auVar215._0_4_ + fVar114;
    local_8c0._4_4_ = auVar215._4_4_ + fVar144;
    fStack_8b8 = auVar215._8_4_ + fVar145;
    fStack_8b4 = auVar215._12_4_ + fVar146;
    fStack_8b0 = fVar147 + 0.0;
    fStack_8ac = fVar148 + 0.0;
    fStack_8a8 = fVar149 + 0.0;
    fStack_8a4 = auVar233._28_4_ + 0.0;
    auVar216 = ZEXT1632(auVar215);
    auVar233 = vsubps_avx(auVar216,auVar25);
    local_640 = vpermps_avx2(_DAT_0205d4a0,auVar233);
    local_840 = vpermps_avx2(_DAT_0205d4a0,auVar216);
    auVar233 = vmaxps_avx(auVar216,_local_8c0);
    auVar219 = vmaxps_avx(local_640,local_840);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar190));
    auVar233 = vmaxps_avx(auVar233,auVar219);
    fVar114 = auVar12._0_4_;
    fVar144 = auVar12._4_4_;
    fVar149 = auVar12._8_4_;
    fVar145 = auVar12._12_4_;
    fVar146 = auVar12._16_4_;
    fVar147 = auVar12._20_4_;
    fVar148 = auVar12._24_4_;
    auVar31._4_4_ = fVar144 * fVar144 * fVar144 * auVar190._4_4_ * -0.5;
    auVar31._0_4_ = fVar114 * fVar114 * fVar114 * auVar190._0_4_ * -0.5;
    auVar31._8_4_ = fVar149 * fVar149 * fVar149 * auVar190._8_4_ * -0.5;
    auVar31._12_4_ = fVar145 * fVar145 * fVar145 * auVar190._12_4_ * -0.5;
    auVar31._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar31._20_4_ = fVar147 * fVar147 * fVar147 * -0.0;
    auVar31._24_4_ = fVar148 * fVar148 * fVar148 * -0.0;
    auVar31._28_4_ = local_920._28_4_;
    auVar98._8_4_ = 0x3fc00000;
    auVar98._0_8_ = 0x3fc000003fc00000;
    auVar98._12_4_ = 0x3fc00000;
    auVar98._16_4_ = 0x3fc00000;
    auVar98._20_4_ = 0x3fc00000;
    auVar98._24_4_ = 0x3fc00000;
    auVar98._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_fma(auVar31,auVar98,auVar12);
    fVar114 = auVar93._0_4_;
    fVar149 = auVar93._4_4_;
    auVar32._4_4_ = fVar196 * fVar149;
    auVar32._0_4_ = fVar186 * fVar114;
    fVar146 = auVar93._8_4_;
    auVar32._8_4_ = fVar197 * fVar146;
    fVar148 = auVar93._12_4_;
    auVar32._12_4_ = fVar198 * fVar148;
    auVar32._16_4_ = fVar199 * 0.0;
    auVar32._20_4_ = fVar253 * 0.0;
    auVar32._24_4_ = fVar254 * 0.0;
    auVar32._28_4_ = 0;
    auVar33._4_4_ = fStack_4bc * fVar163 * fVar149;
    auVar33._0_4_ = local_4c0 * fVar162 * fVar114;
    auVar33._8_4_ = fStack_4b8 * fVar164 * fVar146;
    auVar33._12_4_ = fStack_4b4 * fVar165 * fVar148;
    auVar33._16_4_ = fStack_4b0 * fVar200 * 0.0;
    auVar33._20_4_ = fStack_4ac * fVar201 * 0.0;
    auVar33._24_4_ = fStack_4a8 * fVar235 * 0.0;
    auVar33._28_4_ = auVar157._28_4_;
    auVar93 = vfmadd231ps_fma(auVar33,auVar32,_local_6e0);
    auVar230 = ZEXT1632(auVar87);
    auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar219 = vsubps_avx(auVar99,auVar230);
    fVar186 = auVar219._0_4_;
    auVar261._0_4_ = fVar186 * fVar162 * fVar114;
    fVar196 = auVar219._4_4_;
    auVar261._4_4_ = fVar196 * fVar163 * fVar149;
    fVar197 = auVar219._8_4_;
    auVar261._8_4_ = fVar197 * fVar164 * fVar146;
    fVar198 = auVar219._12_4_;
    auVar261._12_4_ = fVar198 * fVar165 * fVar148;
    fVar199 = auVar219._16_4_;
    auVar261._16_4_ = fVar199 * fVar200 * 0.0;
    fVar200 = auVar219._20_4_;
    auVar261._20_4_ = fVar200 * fVar201 * 0.0;
    fVar201 = auVar219._24_4_;
    auVar261._24_4_ = fVar201 * fVar235 * 0.0;
    auVar261._28_4_ = 0;
    auVar99 = vsubps_avx(auVar99,auVar97);
    auVar190 = vfmadd231ps_fma(auVar261,auVar99,auVar32);
    auVar34._4_4_ = fVar238 * fVar149;
    auVar34._0_4_ = fVar237 * fVar114;
    auVar34._8_4_ = fVar239 * fVar146;
    auVar34._12_4_ = fVar248 * fVar148;
    auVar34._16_4_ = fVar252 * 0.0;
    auVar34._20_4_ = fVar246 * 0.0;
    auVar34._24_4_ = fVar247 * 0.0;
    auVar34._28_4_ = auVar12._28_4_;
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar34,_local_4a0);
    auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar133 = vsubps_avx(auVar100,local_ac0);
    auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar133,auVar34);
    auVar35._4_4_ = fStack_4bc * fVar196;
    auVar35._0_4_ = local_4c0 * fVar186;
    auVar35._8_4_ = fStack_4b8 * fVar197;
    auVar35._12_4_ = fStack_4b4 * fVar198;
    auVar35._16_4_ = fStack_4b0 * fVar199;
    auVar35._20_4_ = fStack_4ac * fVar200;
    auVar35._24_4_ = fStack_4a8 * fVar201;
    auVar35._28_4_ = auVar12._28_4_;
    auVar228 = vfmadd231ps_fma(auVar35,_local_6e0,auVar99);
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),_local_4a0,auVar133);
    fVar144 = auVar190._0_4_;
    fVar235 = auVar93._0_4_;
    fVar145 = auVar190._4_4_;
    fVar237 = auVar93._4_4_;
    fVar147 = auVar190._8_4_;
    fVar238 = auVar93._8_4_;
    fVar162 = auVar190._12_4_;
    fVar239 = auVar93._12_4_;
    auVar36._28_4_ = local_4a0._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar239 * fVar162,
                            CONCAT48(fVar238 * fVar147,CONCAT44(fVar237 * fVar145,fVar235 * fVar144)
                                    )));
    auVar12 = vsubps_avx(ZEXT1632(auVar228),auVar36);
    auVar37._4_4_ = fVar196 * fVar196;
    auVar37._0_4_ = fVar186 * fVar186;
    auVar37._8_4_ = fVar197 * fVar197;
    auVar37._12_4_ = fVar198 * fVar198;
    auVar37._16_4_ = fVar199 * fVar199;
    auVar37._20_4_ = fVar200 * fVar200;
    auVar37._24_4_ = fVar201 * fVar201;
    auVar37._28_4_ = local_4a0._28_4_;
    auVar228 = vfmadd231ps_fma(auVar37,auVar99,auVar99);
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar133,auVar133);
    auVar38._28_4_ = auVar13._28_4_;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar162 * fVar162,
                            CONCAT48(fVar147 * fVar147,CONCAT44(fVar145 * fVar145,fVar144 * fVar144)
                                    )));
    local_660 = vsubps_avx(ZEXT1632(auVar228),auVar38);
    _local_6a0 = vsqrtps_avx(auVar106);
    fVar144 = (auVar233._0_4_ + local_6a0._0_4_) * 1.0000002;
    fVar145 = (auVar233._4_4_ + local_6a0._4_4_) * 1.0000002;
    fVar147 = (auVar233._8_4_ + local_6a0._8_4_) * 1.0000002;
    fVar162 = (auVar233._12_4_ + local_6a0._12_4_) * 1.0000002;
    fVar163 = (auVar233._16_4_ + local_6a0._16_4_) * 1.0000002;
    fVar164 = (auVar233._20_4_ + local_6a0._20_4_) * 1.0000002;
    fVar165 = (auVar233._24_4_ + local_6a0._24_4_) * 1.0000002;
    auVar39._4_4_ = fVar145 * fVar145;
    auVar39._0_4_ = fVar144 * fVar144;
    auVar39._8_4_ = fVar147 * fVar147;
    auVar39._12_4_ = fVar162 * fVar162;
    auVar39._16_4_ = fVar163 * fVar163;
    auVar39._20_4_ = fVar164 * fVar164;
    auVar39._24_4_ = fVar165 * fVar165;
    auVar39._28_4_ = auVar233._28_4_ + local_6a0._28_4_;
    fVar248 = auVar12._0_4_ + auVar12._0_4_;
    fVar252 = auVar12._4_4_ + auVar12._4_4_;
    auVar249._0_8_ = CONCAT44(fVar252,fVar248);
    auVar249._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    auVar249._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    auVar249._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    auVar249._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    auVar249._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    auVar249._28_4_ = auVar12._28_4_ + auVar12._28_4_;
    auVar12 = vsubps_avx(local_660,auVar39);
    auVar223 = ZEXT1632(auVar93);
    auVar40._28_4_ = auVar233._28_4_;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(fVar239 * fVar239,
                            CONCAT48(fVar238 * fVar238,CONCAT44(fVar237 * fVar237,fVar235 * fVar235)
                                    )));
    local_ae0 = vsubps_avx(local_260,auVar40);
    local_680._4_4_ = fVar252 * fVar252;
    local_680._0_4_ = fVar248 * fVar248;
    local_680._8_4_ = auVar249._8_4_ * auVar249._8_4_;
    local_680._12_4_ = auVar249._12_4_ * auVar249._12_4_;
    local_680._16_4_ = auVar249._16_4_ * auVar249._16_4_;
    local_680._20_4_ = auVar249._20_4_ * auVar249._20_4_;
    local_680._24_4_ = auVar249._24_4_ * auVar249._24_4_;
    local_680._28_4_ = 0x3f800002;
    fVar144 = local_ae0._0_4_;
    local_6c0._0_4_ = fVar144 * 4.0;
    fVar145 = local_ae0._4_4_;
    local_6c0._4_4_ = fVar145 * 4.0;
    fVar147 = local_ae0._8_4_;
    fStack_6b8 = fVar147 * 4.0;
    fVar162 = local_ae0._12_4_;
    fStack_6b4 = fVar162 * 4.0;
    fVar163 = local_ae0._16_4_;
    fStack_6b0 = fVar163 * 4.0;
    fVar164 = local_ae0._20_4_;
    fStack_6ac = fVar164 * 4.0;
    fVar165 = local_ae0._24_4_;
    fStack_6a8 = fVar165 * 4.0;
    uStack_6a4 = 0x40800000;
    auVar41._4_4_ = auVar12._4_4_ * (float)local_6c0._4_4_;
    auVar41._0_4_ = auVar12._0_4_ * (float)local_6c0._0_4_;
    auVar41._8_4_ = auVar12._8_4_ * fStack_6b8;
    auVar41._12_4_ = auVar12._12_4_ * fStack_6b4;
    auVar41._16_4_ = auVar12._16_4_ * fStack_6b0;
    auVar41._20_4_ = auVar12._20_4_ * fStack_6ac;
    auVar41._24_4_ = auVar12._24_4_ * fStack_6a8;
    auVar41._28_4_ = 0x40800000;
    auVar233 = vsubps_avx(local_680,auVar41);
    auVar106 = vcmpps_avx(auVar233,auVar100,5);
    auVar234 = ZEXT3264(auVar106);
    auVar224 = ZEXT1632(auVar190);
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      auVar240._8_4_ = 0x7f800000;
      auVar240._0_8_ = 0x7f8000007f800000;
      auVar240._12_4_ = 0x7f800000;
      auVar240._16_4_ = 0x7f800000;
      auVar240._20_4_ = 0x7f800000;
      auVar240._24_4_ = 0x7f800000;
      auVar240._28_4_ = 0x7f800000;
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
    }
    else {
      auVar231 = vsqrtps_avx(auVar233);
      auVar241._0_4_ = fVar144 + fVar144;
      auVar241._4_4_ = fVar145 + fVar145;
      auVar241._8_4_ = fVar147 + fVar147;
      auVar241._12_4_ = fVar162 + fVar162;
      auVar241._16_4_ = fVar163 + fVar163;
      auVar241._20_4_ = fVar164 + fVar164;
      auVar241._24_4_ = fVar165 + fVar165;
      auVar241._28_4_ = (float)local_ae0._28_4_ + (float)local_ae0._28_4_;
      auVar106 = vrcpps_avx(auVar241);
      auVar233 = vcmpps_avx(auVar233,auVar100,5);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar101._16_4_ = 0x3f800000;
      auVar101._20_4_ = 0x3f800000;
      auVar101._24_4_ = 0x3f800000;
      auVar101._28_4_ = 0x3f800000;
      auVar93 = vfnmadd213ps_fma(auVar241,auVar106,auVar101);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar106,auVar106);
      auVar102._0_8_ = CONCAT44(fVar252,fVar248) ^ 0x8000000080000000;
      auVar102._8_4_ = -auVar249._8_4_;
      auVar102._12_4_ = -auVar249._12_4_;
      auVar102._16_4_ = -auVar249._16_4_;
      auVar102._20_4_ = -auVar249._20_4_;
      auVar102._24_4_ = -auVar249._24_4_;
      auVar102._28_4_ = -auVar249._28_4_;
      auVar100 = vsubps_avx(auVar102,auVar231);
      auVar42._4_4_ = auVar93._4_4_ * auVar100._4_4_;
      auVar42._0_4_ = auVar93._0_4_ * auVar100._0_4_;
      auVar42._8_4_ = auVar93._8_4_ * auVar100._8_4_;
      auVar42._12_4_ = auVar93._12_4_ * auVar100._12_4_;
      auVar42._16_4_ = auVar100._16_4_ * 0.0;
      auVar42._20_4_ = auVar100._20_4_ * 0.0;
      auVar42._24_4_ = auVar100._24_4_ * 0.0;
      auVar42._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar231,auVar249);
      auVar43._4_4_ = auVar93._4_4_ * auVar100._4_4_;
      auVar43._0_4_ = auVar93._0_4_ * auVar100._0_4_;
      auVar43._8_4_ = auVar93._8_4_ * auVar100._8_4_;
      auVar43._12_4_ = auVar93._12_4_ * auVar100._12_4_;
      auVar43._16_4_ = auVar100._16_4_ * 0.0;
      auVar43._20_4_ = auVar100._20_4_ * 0.0;
      auVar43._24_4_ = auVar100._24_4_ * 0.0;
      auVar43._28_4_ = auVar106._28_4_;
      auVar93 = vfmadd213ps_fma(auVar223,auVar42,auVar224);
      local_440 = ZEXT1632(CONCAT412(fVar148 * auVar93._12_4_,
                                     CONCAT48(fVar146 * auVar93._8_4_,
                                              CONCAT44(fVar149 * auVar93._4_4_,
                                                       fVar114 * auVar93._0_4_))));
      auVar93 = vfmadd213ps_fma(auVar223,auVar43,auVar224);
      local_460 = ZEXT1632(CONCAT412(fVar148 * auVar93._12_4_,
                                     CONCAT48(fVar146 * auVar93._8_4_,
                                              CONCAT44(fVar149 * auVar93._4_4_,
                                                       fVar114 * auVar93._0_4_))));
      auVar155._8_4_ = 0x7f800000;
      auVar155._0_8_ = 0x7f8000007f800000;
      auVar155._12_4_ = 0x7f800000;
      auVar155._16_4_ = 0x7f800000;
      auVar155._20_4_ = 0x7f800000;
      auVar155._24_4_ = 0x7f800000;
      auVar155._28_4_ = 0x7f800000;
      auVar240 = vblendvps_avx(auVar155,auVar42,auVar233);
      auVar106 = vandps_avx(auVar40,local_740);
      auVar106 = vmaxps_avx(local_3a0,auVar106);
      auVar44._4_4_ = auVar106._4_4_ * 1.9073486e-06;
      auVar44._0_4_ = auVar106._0_4_ * 1.9073486e-06;
      auVar44._8_4_ = auVar106._8_4_ * 1.9073486e-06;
      auVar44._12_4_ = auVar106._12_4_ * 1.9073486e-06;
      auVar44._16_4_ = auVar106._16_4_ * 1.9073486e-06;
      auVar44._20_4_ = auVar106._20_4_ * 1.9073486e-06;
      auVar44._24_4_ = auVar106._24_4_ * 1.9073486e-06;
      auVar44._28_4_ = auVar106._28_4_;
      auVar106 = vandps_avx(local_740,local_ae0);
      auVar106 = vcmpps_avx(auVar106,auVar44,1);
      auVar103._8_4_ = 0xff800000;
      auVar103._0_8_ = 0xff800000ff800000;
      auVar103._12_4_ = 0xff800000;
      auVar103._16_4_ = 0xff800000;
      auVar103._20_4_ = 0xff800000;
      auVar103._24_4_ = 0xff800000;
      auVar103._28_4_ = 0xff800000;
      auVar250 = vblendvps_avx(auVar103,auVar43,auVar233);
      auVar100 = auVar233 & auVar106;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0x7f,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0xbf,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar100[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar106,auVar233);
        auVar100 = vcmpps_avx(auVar12,_DAT_02020f00,2);
        auVar221._8_4_ = 0xff800000;
        auVar221._0_8_ = 0xff800000ff800000;
        auVar221._12_4_ = 0xff800000;
        auVar221._16_4_ = 0xff800000;
        auVar221._20_4_ = 0xff800000;
        auVar221._24_4_ = 0xff800000;
        auVar221._28_4_ = 0xff800000;
        auVar269._8_4_ = 0x7f800000;
        auVar269._0_8_ = 0x7f8000007f800000;
        auVar269._12_4_ = 0x7f800000;
        auVar269._16_4_ = 0x7f800000;
        auVar269._20_4_ = 0x7f800000;
        auVar269._24_4_ = 0x7f800000;
        auVar269._28_4_ = 0x7f800000;
        auVar12 = vblendvps_avx(auVar269,auVar221,auVar100);
        auVar93 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
        auVar231 = vpmovsxwd_avx2(auVar93);
        auVar240 = vblendvps_avx(auVar240,auVar12,auVar231);
        auVar12 = vblendvps_avx(auVar221,auVar269,auVar100);
        auVar250 = vblendvps_avx(auVar250,auVar12,auVar231);
        auVar109._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
        auVar109._8_4_ = auVar106._8_4_ ^ 0xffffffff;
        auVar109._12_4_ = auVar106._12_4_ ^ 0xffffffff;
        auVar109._16_4_ = auVar106._16_4_ ^ 0xffffffff;
        auVar109._20_4_ = auVar106._20_4_ ^ 0xffffffff;
        auVar109._24_4_ = auVar106._24_4_ ^ 0xffffffff;
        auVar109._28_4_ = auVar106._28_4_ ^ 0xffffffff;
        auVar106 = vorps_avx(auVar100,auVar109);
        auVar106 = vandps_avx(auVar233,auVar106);
        auVar234 = ZEXT3264(auVar106);
      }
    }
    auVar233 = auVar234._0_32_;
    auVar106 = local_280 & auVar233;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
LAB_018bfc06:
      auVar244 = ZEXT3264(local_980);
      auVar227 = ZEXT3264(local_9e0);
      auVar236 = ZEXT3264(local_860);
    }
    else {
      fVar235 = (ray->org).field_0.m128[3] - (float)local_770._0_4_;
      auVar104._4_4_ = fVar235;
      auVar104._0_4_ = fVar235;
      auVar104._8_4_ = fVar235;
      auVar104._12_4_ = fVar235;
      auVar104._16_4_ = fVar235;
      auVar104._20_4_ = fVar235;
      auVar104._24_4_ = fVar235;
      auVar104._28_4_ = fVar235;
      auVar12 = vmaxps_avx(auVar104,auVar240);
      fVar235 = ray->tfar - (float)local_770._0_4_;
      auVar209._4_4_ = fVar235;
      auVar209._0_4_ = fVar235;
      auVar209._8_4_ = fVar235;
      auVar209._12_4_ = fVar235;
      auVar209._16_4_ = fVar235;
      auVar209._20_4_ = fVar235;
      auVar209._24_4_ = fVar235;
      auVar209._28_4_ = fVar235;
      auVar45._4_4_ = fVar196 * local_620._4_4_;
      auVar45._0_4_ = fVar186 * local_620._0_4_;
      auVar45._8_4_ = fVar197 * local_620._8_4_;
      auVar45._12_4_ = fVar198 * local_620._12_4_;
      auVar45._16_4_ = fVar199 * local_620._16_4_;
      auVar45._20_4_ = fVar200 * local_620._20_4_;
      auVar45._24_4_ = fVar201 * local_620._24_4_;
      auVar45._28_4_ = auVar219._28_4_;
      auVar93 = vfmadd213ps_fma(auVar99,local_9c0,auVar45);
      auVar190 = vfmadd213ps_fma(auVar133,_local_7e0,ZEXT1632(auVar93));
      auVar46._4_4_ = fStack_4bc * local_620._4_4_;
      auVar46._0_4_ = local_4c0 * local_620._0_4_;
      auVar46._8_4_ = fStack_4b8 * local_620._8_4_;
      auVar46._12_4_ = fStack_4b4 * local_620._12_4_;
      auVar46._16_4_ = fStack_4b0 * local_620._16_4_;
      auVar46._20_4_ = fStack_4ac * local_620._20_4_;
      auVar46._24_4_ = fStack_4a8 * local_620._24_4_;
      auVar46._28_4_ = 0;
      auVar93 = vfmadd231ps_fma(auVar46,_local_6e0,local_9c0);
      auVar228 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_4a0,_local_7e0);
      auVar106 = vandps_avx(ZEXT1632(auVar228),local_740);
      auVar262._8_4_ = 0x219392ef;
      auVar262._0_8_ = 0x219392ef219392ef;
      auVar262._12_4_ = 0x219392ef;
      auVar262._16_4_ = 0x219392ef;
      auVar262._20_4_ = 0x219392ef;
      auVar262._24_4_ = 0x219392ef;
      auVar262._28_4_ = 0x219392ef;
      auVar219 = vcmpps_avx(auVar106,auVar262,1);
      auVar234 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar106 = vrcpps_avx(ZEXT1632(auVar228));
      auVar257._8_4_ = 0x3f800000;
      auVar257._0_8_ = &DAT_3f8000003f800000;
      auVar257._12_4_ = 0x3f800000;
      auVar257._16_4_ = 0x3f800000;
      auVar257._20_4_ = 0x3f800000;
      auVar257._24_4_ = 0x3f800000;
      auVar257._28_4_ = 0x3f800000;
      auVar133 = ZEXT1632(auVar228);
      auVar93 = vfnmadd213ps_fma(auVar106,auVar133,auVar257);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar106,auVar106);
      auVar181._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = auVar228._8_4_ ^ 0x80000000;
      auVar181._12_4_ = auVar228._12_4_ ^ 0x80000000;
      auVar181._16_4_ = 0x80000000;
      auVar181._20_4_ = 0x80000000;
      auVar181._24_4_ = 0x80000000;
      auVar181._28_4_ = 0x80000000;
      auVar242._0_4_ = auVar93._0_4_ * -auVar190._0_4_;
      auVar242._4_4_ = auVar93._4_4_ * -auVar190._4_4_;
      auVar242._8_4_ = auVar93._8_4_ * -auVar190._8_4_;
      auVar242._12_4_ = auVar93._12_4_ * -auVar190._12_4_;
      auVar242._16_4_ = 0x80000000;
      auVar242._20_4_ = 0x80000000;
      auVar242._24_4_ = 0x80000000;
      auVar242._28_4_ = 0;
      auVar106 = vcmpps_avx(auVar133,auVar181,1);
      auVar106 = vorps_avx(auVar219,auVar106);
      auVar267._8_4_ = 0xff800000;
      auVar267._0_8_ = 0xff800000ff800000;
      auVar267._12_4_ = 0xff800000;
      auVar267._16_4_ = 0xff800000;
      auVar267._20_4_ = 0xff800000;
      auVar267._24_4_ = 0xff800000;
      auVar267._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar242,auVar267,auVar106);
      auVar99 = vminps_avx(auVar209,auVar250);
      auVar12 = vmaxps_avx(auVar12,auVar106);
      auVar106 = vcmpps_avx(auVar133,auVar181,6);
      auVar106 = vorps_avx(auVar219,auVar106);
      auVar268._8_4_ = 0x7f800000;
      auVar268._0_8_ = 0x7f8000007f800000;
      auVar268._12_4_ = 0x7f800000;
      auVar268._16_4_ = 0x7f800000;
      auVar268._20_4_ = 0x7f800000;
      auVar268._24_4_ = 0x7f800000;
      auVar268._28_4_ = 0x7f800000;
      auVar106 = vblendvps_avx(auVar242,auVar268,auVar106);
      auVar99 = vminps_avx(auVar99,auVar106);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x40,local_7a0);
      auVar219 = vsubps_avx(ZEXT832(0) << 0x40,local_7c0);
      auVar47._4_4_ = auVar219._4_4_ * fVar270;
      auVar47._0_4_ = auVar219._0_4_ * fVar85;
      auVar47._8_4_ = auVar219._8_4_ * fVar271;
      auVar47._12_4_ = auVar219._12_4_ * fVar272;
      auVar47._16_4_ = auVar219._16_4_ * fVar9;
      auVar47._20_4_ = auVar219._20_4_ * fVar10;
      auVar47._24_4_ = auVar219._24_4_ * fVar11;
      auVar47._28_4_ = auVar219._28_4_;
      auVar93 = vfnmsub231ps_fma(auVar47,local_920,auVar106);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x40,auVar14);
      auVar190 = vfnmadd231ps_fma(ZEXT1632(auVar93),local_a80,auVar106);
      auVar48._4_4_ = fStack_4bc * fVar270;
      auVar48._0_4_ = local_4c0 * fVar85;
      auVar48._8_4_ = fStack_4b8 * fVar271;
      auVar48._12_4_ = fStack_4b4 * fVar272;
      auVar48._16_4_ = fStack_4b0 * fVar9;
      auVar48._20_4_ = fStack_4ac * fVar10;
      auVar48._24_4_ = fStack_4a8 * fVar11;
      auVar48._28_4_ = auVar106._28_4_;
      auVar93 = vfnmsub231ps_fma(auVar48,local_920,_local_6e0);
      auVar228 = vfnmadd231ps_fma(ZEXT1632(auVar93),_local_4a0,local_a80);
      auVar106 = vandps_avx(ZEXT1632(auVar228),local_740);
      auVar133 = vrcpps_avx(ZEXT1632(auVar228));
      auVar192._8_4_ = 0x219392ef;
      auVar192._0_8_ = 0x219392ef219392ef;
      auVar192._12_4_ = 0x219392ef;
      auVar192._16_4_ = 0x219392ef;
      auVar192._20_4_ = 0x219392ef;
      auVar192._24_4_ = 0x219392ef;
      auVar192._28_4_ = 0x219392ef;
      auVar219 = vcmpps_avx(auVar106,auVar192,1);
      auVar100 = ZEXT1632(auVar228);
      auVar93 = vfnmadd213ps_fma(auVar133,auVar100,auVar257);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar133,auVar133);
      auVar220._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
      auVar220._8_4_ = auVar228._8_4_ ^ 0x80000000;
      auVar220._12_4_ = auVar228._12_4_ ^ 0x80000000;
      auVar220._16_4_ = 0x80000000;
      auVar220._20_4_ = 0x80000000;
      auVar220._24_4_ = 0x80000000;
      auVar220._28_4_ = 0x80000000;
      auVar49._4_4_ = auVar93._4_4_ * -auVar190._4_4_;
      auVar49._0_4_ = auVar93._0_4_ * -auVar190._0_4_;
      auVar49._8_4_ = auVar93._8_4_ * -auVar190._8_4_;
      auVar49._12_4_ = auVar93._12_4_ * -auVar190._12_4_;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar106 = vcmpps_avx(auVar100,auVar220,1);
      auVar106 = vorps_avx(auVar106,auVar219);
      auVar193._8_4_ = 0xff800000;
      auVar193._0_8_ = 0xff800000ff800000;
      auVar193._12_4_ = 0xff800000;
      auVar193._16_4_ = 0xff800000;
      auVar193._20_4_ = 0xff800000;
      auVar193._24_4_ = 0xff800000;
      auVar193._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar49,auVar193,auVar106);
      _local_720 = vmaxps_avx(auVar12,auVar106);
      auVar106 = vcmpps_avx(auVar100,auVar220,6);
      auVar106 = vorps_avx(auVar219,auVar106);
      auVar219 = vblendvps_avx(auVar49,auVar268,auVar106);
      auVar106 = vandps_avx(local_280,auVar233);
      local_400 = vminps_avx(auVar99,auVar219);
      auVar233 = vcmpps_avx(_local_720,local_400,2);
      auVar219 = auVar106 & auVar233;
      if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar219 >> 0x7f,0) == '\0') &&
            (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar219 >> 0xbf,0) == '\0') &&
          (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar219[0x1f]) goto LAB_018bfc06;
      auVar219 = vminps_avx(local_440,auVar257);
      auVar219 = vmaxps_avx(auVar219,ZEXT832(0) << 0x20);
      auVar12 = vminps_avx(local_460,auVar257);
      auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
      auVar51._4_4_ = (auVar219._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar219._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar219._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar219._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar219._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar219._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar219._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar219._28_4_ + 7.0;
      auVar93 = vfmadd213ps_fma(auVar51,local_880,local_800);
      auVar52._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar12._28_4_ + 7.0;
      auVar190 = vfmadd213ps_fma(auVar52,local_880,local_800);
      auVar219 = vminps_avx(auVar216,_local_8c0);
      auVar12 = vminps_avx(local_640,local_840);
      auVar219 = vminps_avx(auVar219,auVar12);
      auVar219 = vsubps_avx(auVar219,_local_6a0);
      auVar106 = vandps_avx(auVar233,auVar106);
      local_440 = ZEXT1632(auVar93);
      local_460 = ZEXT1632(auVar190);
      auVar53._4_4_ = auVar219._4_4_ * 0.99999976;
      auVar53._0_4_ = auVar219._0_4_ * 0.99999976;
      auVar53._8_4_ = auVar219._8_4_ * 0.99999976;
      auVar53._12_4_ = auVar219._12_4_ * 0.99999976;
      auVar53._16_4_ = auVar219._16_4_ * 0.99999976;
      auVar53._20_4_ = auVar219._20_4_ * 0.99999976;
      auVar53._24_4_ = auVar219._24_4_ * 0.99999976;
      auVar53._28_4_ = 0x3f7ffffc;
      auVar233 = vmaxps_avx(ZEXT832(0) << 0x40,auVar53);
      auVar54._4_4_ = auVar233._4_4_ * auVar233._4_4_;
      auVar54._0_4_ = auVar233._0_4_ * auVar233._0_4_;
      auVar54._8_4_ = auVar233._8_4_ * auVar233._8_4_;
      auVar54._12_4_ = auVar233._12_4_ * auVar233._12_4_;
      auVar54._16_4_ = auVar233._16_4_ * auVar233._16_4_;
      auVar54._20_4_ = auVar233._20_4_ * auVar233._20_4_;
      auVar54._24_4_ = auVar233._24_4_ * auVar233._24_4_;
      auVar54._28_4_ = auVar233._28_4_;
      auVar219 = vsubps_avx(local_660,auVar54);
      auVar55._4_4_ = auVar219._4_4_ * (float)local_6c0._4_4_;
      auVar55._0_4_ = auVar219._0_4_ * (float)local_6c0._0_4_;
      auVar55._8_4_ = auVar219._8_4_ * fStack_6b8;
      auVar55._12_4_ = auVar219._12_4_ * fStack_6b4;
      auVar55._16_4_ = auVar219._16_4_ * fStack_6b0;
      auVar55._20_4_ = auVar219._20_4_ * fStack_6ac;
      auVar55._24_4_ = auVar219._24_4_ * fStack_6a8;
      auVar55._28_4_ = auVar233._28_4_;
      auVar12 = vsubps_avx(local_680,auVar55);
      local_8e0 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
      auVar233 = local_8e0;
      if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0x7f,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8e0 >> 0xbf,0) == '\0') &&
          (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8e0[0x1f]) {
        auVar66 = ZEXT412(0);
        auVar157 = ZEXT1232(auVar66) << 0x20;
        local_5e0 = ZEXT1232(auVar66) << 0x20;
        _local_600 = ZEXT1232(auVar66) << 0x20;
        auVar183 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_b00 = ZEXT832(0) << 0x20;
        auVar210._8_4_ = 0x7f800000;
        auVar210._0_8_ = 0x7f8000007f800000;
        auVar210._12_4_ = 0x7f800000;
        auVar210._16_4_ = 0x7f800000;
        auVar210._20_4_ = 0x7f800000;
        auVar210._24_4_ = 0x7f800000;
        auVar210._28_4_ = 0x7f800000;
        auVar217._8_4_ = 0xff800000;
        auVar217._0_8_ = 0xff800000ff800000;
        auVar217._12_4_ = 0xff800000;
        auVar217._16_4_ = 0xff800000;
        auVar217._20_4_ = 0xff800000;
        auVar217._24_4_ = 0xff800000;
        auVar217._28_4_ = 0xff800000;
        local_8e0 = auVar14;
        local_5c0 = local_5e0;
      }
      else {
        auVar158._0_4_ = fVar144 + fVar144;
        auVar158._4_4_ = fVar145 + fVar145;
        auVar158._8_4_ = fVar147 + fVar147;
        auVar158._12_4_ = fVar162 + fVar162;
        auVar158._16_4_ = fVar163 + fVar163;
        auVar158._20_4_ = fVar164 + fVar164;
        auVar158._24_4_ = fVar165 + fVar165;
        auVar158._28_4_ = (float)local_ae0._28_4_ + (float)local_ae0._28_4_;
        auVar99 = vrcpps_avx(auVar158);
        auVar93 = vfnmadd213ps_fma(auVar158,auVar99,auVar257);
        auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar99,auVar99);
        auVar99 = vsqrtps_avx(auVar12);
        auVar194._0_8_ = auVar249._0_8_ ^ 0x8000000080000000;
        auVar194._8_4_ = -auVar249._8_4_;
        auVar194._12_4_ = -auVar249._12_4_;
        auVar194._16_4_ = -auVar249._16_4_;
        auVar194._20_4_ = -auVar249._20_4_;
        auVar194._24_4_ = -auVar249._24_4_;
        auVar194._28_4_ = -auVar249._28_4_;
        auVar133 = vsubps_avx(auVar194,auVar99);
        auVar99 = vsubps_avx(auVar99,auVar249);
        fVar85 = auVar133._0_4_ * auVar93._0_4_;
        fVar144 = auVar133._4_4_ * auVar93._4_4_;
        auVar56._4_4_ = fVar144;
        auVar56._0_4_ = fVar85;
        fVar270 = auVar133._8_4_ * auVar93._8_4_;
        auVar56._8_4_ = fVar270;
        fVar145 = auVar133._12_4_ * auVar93._12_4_;
        auVar56._12_4_ = fVar145;
        fVar271 = auVar133._16_4_ * 0.0;
        auVar56._16_4_ = fVar271;
        fVar147 = auVar133._20_4_ * 0.0;
        auVar56._20_4_ = fVar147;
        fVar272 = auVar133._24_4_ * 0.0;
        auVar56._24_4_ = fVar272;
        auVar56._28_4_ = 0x7f800000;
        auVar263._0_4_ = auVar99._0_4_ * auVar93._0_4_;
        auVar263._4_4_ = auVar99._4_4_ * auVar93._4_4_;
        auVar263._8_4_ = auVar99._8_4_ * auVar93._8_4_;
        auVar263._12_4_ = auVar99._12_4_ * auVar93._12_4_;
        auVar263._16_4_ = auVar99._16_4_ * 0.0;
        auVar263._20_4_ = auVar99._20_4_ * 0.0;
        auVar263._24_4_ = auVar99._24_4_ * 0.0;
        auVar263._28_4_ = 0;
        auVar93 = vfmadd213ps_fma(auVar223,auVar56,auVar224);
        auVar190 = vfmadd213ps_fma(auVar223,auVar263,auVar224);
        auVar57._28_4_ = auVar133._28_4_;
        auVar57._0_28_ =
             ZEXT1628(CONCAT412(fVar148 * auVar93._12_4_,
                                CONCAT48(fVar146 * auVar93._8_4_,
                                         CONCAT44(fVar149 * auVar93._4_4_,fVar114 * auVar93._0_4_)))
                     );
        auVar99 = ZEXT1632(CONCAT412(fVar148 * auVar190._12_4_,
                                     CONCAT48(fVar146 * auVar190._8_4_,
                                              CONCAT44(fVar149 * auVar190._4_4_,
                                                       fVar114 * auVar190._0_4_))));
        auVar93 = vfmadd213ps_fma(auVar13,auVar57,local_ac0);
        auVar190 = vfmadd213ps_fma(auVar13,auVar99,local_ac0);
        auVar228 = vfmadd213ps_fma(auVar183,auVar57,auVar97);
        auVar121 = vfmadd213ps_fma(auVar183,auVar99,auVar97);
        auVar130 = vfmadd213ps_fma(auVar57,auVar157,auVar230);
        auVar151 = vfmadd213ps_fma(auVar157,auVar99,auVar230);
        auVar58._4_4_ = fVar144 * (float)local_4a0._4_4_;
        auVar58._0_4_ = fVar85 * (float)local_4a0._0_4_;
        auVar58._8_4_ = fVar270 * fStack_498;
        auVar58._12_4_ = fVar145 * fStack_494;
        auVar58._16_4_ = fVar271 * fStack_490;
        auVar58._20_4_ = fVar147 * fStack_48c;
        auVar58._24_4_ = fVar272 * fStack_488;
        auVar58._28_4_ = 0;
        auVar157 = vsubps_avx(auVar58,ZEXT1632(auVar93));
        auVar184._0_4_ = fVar85 * (float)local_6e0._0_4_;
        auVar184._4_4_ = fVar144 * (float)local_6e0._4_4_;
        auVar184._8_4_ = fVar270 * fStack_6d8;
        auVar184._12_4_ = fVar145 * fStack_6d4;
        auVar184._16_4_ = fVar271 * fStack_6d0;
        auVar184._20_4_ = fVar147 * fStack_6cc;
        auVar184._24_4_ = fVar272 * fStack_6c8;
        auVar184._28_4_ = 0;
        auVar183 = vsubps_avx(auVar184,ZEXT1632(auVar228));
        auVar211._0_4_ = local_4c0 * fVar85;
        auVar211._4_4_ = fStack_4bc * fVar144;
        auVar211._8_4_ = fStack_4b8 * fVar270;
        auVar211._12_4_ = fStack_4b4 * fVar145;
        auVar211._16_4_ = fStack_4b0 * fVar271;
        auVar211._20_4_ = fStack_4ac * fVar147;
        auVar211._24_4_ = fStack_4a8 * fVar272;
        auVar211._28_4_ = 0;
        _local_b00 = vsubps_avx(auVar211,ZEXT1632(auVar130));
        auVar59._4_4_ = auVar263._4_4_ * (float)local_4a0._4_4_;
        auVar59._0_4_ = auVar263._0_4_ * (float)local_4a0._0_4_;
        auVar59._8_4_ = auVar263._8_4_ * fStack_498;
        auVar59._12_4_ = auVar263._12_4_ * fStack_494;
        auVar59._16_4_ = auVar263._16_4_ * fStack_490;
        auVar59._20_4_ = auVar263._20_4_ * fStack_48c;
        auVar59._24_4_ = auVar263._24_4_ * fStack_488;
        auVar59._28_4_ = 0;
        local_5c0 = vsubps_avx(auVar59,ZEXT1632(auVar190));
        auVar60._4_4_ = auVar263._4_4_ * (float)local_6e0._4_4_;
        auVar60._0_4_ = auVar263._0_4_ * (float)local_6e0._0_4_;
        auVar60._8_4_ = auVar263._8_4_ * fStack_6d8;
        auVar60._12_4_ = auVar263._12_4_ * fStack_6d4;
        auVar60._16_4_ = auVar263._16_4_ * fStack_6d0;
        auVar60._20_4_ = auVar263._20_4_ * fStack_6cc;
        auVar60._24_4_ = auVar263._24_4_ * fStack_6c8;
        auVar60._28_4_ = local_5c0._28_4_;
        local_5e0 = vsubps_avx(auVar60,ZEXT1632(auVar121));
        auVar61._4_4_ = fStack_4bc * auVar263._4_4_;
        auVar61._0_4_ = local_4c0 * auVar263._0_4_;
        auVar61._8_4_ = fStack_4b8 * auVar263._8_4_;
        auVar61._12_4_ = fStack_4b4 * auVar263._12_4_;
        auVar61._16_4_ = fStack_4b0 * auVar263._16_4_;
        auVar61._20_4_ = fStack_4ac * auVar263._20_4_;
        auVar61._24_4_ = fStack_4a8 * auVar263._24_4_;
        auVar61._28_4_ = local_5e0._28_4_;
        _local_600 = vsubps_avx(auVar61,ZEXT1632(auVar151));
        auVar13 = vcmpps_avx(auVar12,_DAT_02020f00,5);
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar210 = vblendvps_avx(auVar212,auVar56,auVar13);
        auVar12 = vandps_avx(local_740,auVar40);
        auVar12 = vmaxps_avx(local_3a0,auVar12);
        auVar62._4_4_ = auVar12._4_4_ * 1.9073486e-06;
        auVar62._0_4_ = auVar12._0_4_ * 1.9073486e-06;
        auVar62._8_4_ = auVar12._8_4_ * 1.9073486e-06;
        auVar62._12_4_ = auVar12._12_4_ * 1.9073486e-06;
        auVar62._16_4_ = auVar12._16_4_ * 1.9073486e-06;
        auVar62._20_4_ = auVar12._20_4_ * 1.9073486e-06;
        auVar62._24_4_ = auVar12._24_4_ * 1.9073486e-06;
        auVar62._28_4_ = auVar12._28_4_;
        auVar12 = vandps_avx(local_740,local_ae0);
        auVar12 = vcmpps_avx(auVar12,auVar62,1);
        auVar234 = ZEXT3264(auVar12);
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        auVar217 = vblendvps_avx(auVar218,auVar263,auVar13);
        auVar99 = auVar13 & auVar12;
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0x7f,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0xbf,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar99[0x1f] < '\0') {
          auVar233 = vandps_avx(auVar12,auVar13);
          auVar12 = vcmpps_avx(auVar219,ZEXT832(0) << 0x20,2);
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar219 = vblendvps_avx(auVar259,auVar251,auVar12);
          auVar93 = vpackssdw_avx(auVar233._0_16_,auVar233._16_16_);
          auVar99 = vpmovsxwd_avx2(auVar93);
          auVar234 = ZEXT3264(auVar99);
          auVar210 = vblendvps_avx(auVar210,auVar219,auVar99);
          auVar219 = vblendvps_avx(auVar251,auVar259,auVar12);
          auVar217 = vblendvps_avx(auVar217,auVar219,auVar99);
          auVar226._0_8_ = auVar233._0_8_ ^ 0xffffffffffffffff;
          auVar226._8_4_ = auVar233._8_4_ ^ 0xffffffff;
          auVar226._12_4_ = auVar233._12_4_ ^ 0xffffffff;
          auVar226._16_4_ = auVar233._16_4_ ^ 0xffffffff;
          auVar226._20_4_ = auVar233._20_4_ ^ 0xffffffff;
          auVar226._24_4_ = auVar233._24_4_ ^ 0xffffffff;
          auVar226._28_4_ = auVar233._28_4_ ^ 0xffffffff;
          auVar233 = vorps_avx(auVar12,auVar226);
          auVar233 = vandps_avx(auVar233,auVar13);
        }
      }
      uVar83 = *(undefined4 *)&(ray->dir).field_0;
      auVar258._4_4_ = uVar83;
      auVar258._0_4_ = uVar83;
      auVar258._8_4_ = uVar83;
      auVar258._12_4_ = uVar83;
      auVar258._16_4_ = uVar83;
      auVar258._20_4_ = uVar83;
      auVar258._24_4_ = uVar83;
      auVar258._28_4_ = uVar83;
      uVar83 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      local_8a0._4_4_ = uVar83;
      local_8a0._0_4_ = uVar83;
      local_8a0._8_4_ = uVar83;
      local_8a0._12_4_ = uVar83;
      local_8a0._16_4_ = uVar83;
      local_8a0._20_4_ = uVar83;
      local_8a0._24_4_ = uVar83;
      local_8a0._28_4_ = uVar83;
      fVar85 = (ray->dir).field_0.m128[2];
      local_3e0 = _local_720;
      local_3c0 = vminps_avx(local_400,auVar210);
      _local_520 = vmaxps_avx(_local_720,auVar217);
      _local_420 = _local_520;
      auVar219 = vcmpps_avx(_local_720,local_3c0,2);
      local_4e0 = vandps_avx(auVar219,auVar106);
      auVar219 = vcmpps_avx(_local_520,local_400,2);
      local_580 = vandps_avx(auVar219,auVar106);
      auVar106 = vorps_avx(local_580,local_4e0);
      auVar244 = ZEXT3264(local_980);
      auVar236 = ZEXT3264(local_860);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        auVar227 = ZEXT3264(local_9e0);
        local_5a0._0_8_ = uVar84;
      }
      else {
        local_320._0_8_ = auVar233._0_8_ ^ 0xffffffffffffffff;
        local_320._8_4_ = auVar233._8_4_ ^ 0xffffffff;
        local_320._12_4_ = auVar233._12_4_ ^ 0xffffffff;
        local_320._16_4_ = auVar233._16_4_ ^ 0xffffffff;
        local_320._20_4_ = auVar233._20_4_ ^ 0xffffffff;
        local_320._24_4_ = auVar233._24_4_ ^ 0xffffffff;
        local_320._28_4_ = auVar233._28_4_ ^ 0xffffffff;
        auVar63._4_4_ = fVar85 * (float)local_b00._4_4_;
        auVar63._0_4_ = fVar85 * (float)local_b00._0_4_;
        auVar63._8_4_ = fVar85 * fStack_af8;
        auVar63._12_4_ = fVar85 * fStack_af4;
        auVar63._16_4_ = fVar85 * fStack_af0;
        auVar63._20_4_ = fVar85 * fStack_aec;
        auVar63._24_4_ = fVar85 * fStack_ae8;
        auVar63._28_4_ = auVar106._28_4_;
        auVar93 = vfmadd213ps_fma(auVar183,local_8a0,auVar63);
        auVar93 = vfmadd213ps_fma(auVar157,auVar258,ZEXT1632(auVar93));
        auVar106 = vandps_avx(ZEXT1632(auVar93),local_740);
        auVar136._8_4_ = 0x3e99999a;
        auVar136._0_8_ = 0x3e99999a3e99999a;
        auVar136._12_4_ = 0x3e99999a;
        auVar136._16_4_ = 0x3e99999a;
        auVar136._20_4_ = 0x3e99999a;
        auVar136._24_4_ = 0x3e99999a;
        auVar136._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar136,1);
        auVar106 = vorps_avx(auVar106,local_320);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar159,auVar137,auVar106);
        uVar83 = (undefined4)uVar84;
        local_340._4_4_ = uVar83;
        local_340._0_4_ = uVar83;
        local_340._8_4_ = uVar83;
        local_340._12_4_ = uVar83;
        local_340._16_4_ = uVar83;
        local_340._20_4_ = uVar83;
        local_340._24_4_ = uVar83;
        local_340._28_4_ = uVar83;
        local_500 = vpcmpgtd_avx2(auVar106,local_340);
        local_560 = vpandn_avx2(local_500,local_4e0);
        auVar236 = ZEXT3264(local_560);
        auVar106 = local_4e0 & ~local_500;
        local_5a0 = ZEXT1632(CONCAT88(auVar87._8_8_,uVar84));
        local_540 = local_580;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar227 = ZEXT3264(local_9e0);
          auVar219 = local_8a0;
          fVar270 = fVar85;
          fVar149 = fVar85;
          fVar145 = fVar85;
          fVar271 = fVar85;
          fVar146 = fVar85;
          fVar147 = fVar85;
          local_8a0._16_16_ = (undefined1  [16])0x0;
        }
        else {
          auVar190 = vminps_avx(local_a20,local_a40);
          auVar93 = vmaxps_avx(local_a20,local_a40);
          local_8c0._4_4_ = fVar85;
          local_8c0._0_4_ = fVar85;
          fStack_8b8 = fVar85;
          fStack_8b4 = fVar85;
          fStack_8b0 = fVar85;
          fStack_8ac = fVar85;
          fStack_8a8 = fVar85;
          fStack_8a4 = fVar85;
          auVar228 = vminps_avx(local_a30,_local_a50);
          auVar121 = vminps_avx(auVar190,auVar228);
          auVar190 = vmaxps_avx(local_a30,_local_a50);
          auVar228 = vmaxps_avx(auVar93,auVar190);
          auVar166._8_4_ = 0x7fffffff;
          auVar166._0_8_ = 0x7fffffff7fffffff;
          auVar166._12_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar121,auVar166);
          local_640._0_16_ = auVar166;
          auVar190 = vandps_avx(auVar228,auVar166);
          auVar93 = vmaxps_avx(auVar93,auVar190);
          auVar190 = vmovshdup_avx(auVar93);
          auVar190 = vmaxss_avx(auVar190,auVar93);
          auVar93 = vshufpd_avx(auVar93,auVar93,1);
          auVar93 = vmaxss_avx(auVar93,auVar190);
          local_7c0._0_4_ = auVar93._0_4_ * 1.9073486e-06;
          auVar93 = vshufps_avx(auVar228,auVar228,0xff);
          _local_6c0 = auVar93;
          local_700._4_4_ = (float)local_720._4_4_ + (float)local_820._4_4_;
          local_700._0_4_ = (float)local_720._0_4_ + (float)local_820._0_4_;
          fStack_6f8 = fStack_718 + fStack_818;
          fStack_6f4 = fStack_714 + fStack_814;
          fStack_6f0 = fStack_710 + fStack_810;
          fStack_6ec = fStack_70c + fStack_80c;
          fStack_6e8 = fStack_708 + fStack_808;
          fStack_6e4 = fStack_704 + fStack_804;
          local_880 = auVar258;
          do {
            auVar138._8_4_ = 0x7f800000;
            auVar138._0_8_ = 0x7f8000007f800000;
            auVar138._12_4_ = 0x7f800000;
            auVar138._16_4_ = 0x7f800000;
            auVar138._20_4_ = 0x7f800000;
            auVar138._24_4_ = 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar106 = auVar236._0_32_;
            auVar233 = vblendvps_avx(auVar138,_local_720,auVar106);
            auVar219 = vshufps_avx(auVar233,auVar233,0xb1);
            auVar219 = vminps_avx(auVar233,auVar219);
            auVar12 = vshufpd_avx(auVar219,auVar219,5);
            auVar219 = vminps_avx(auVar219,auVar12);
            auVar12 = vpermpd_avx2(auVar219,0x4e);
            auVar219 = vminps_avx(auVar219,auVar12);
            auVar233 = vcmpps_avx(auVar233,auVar219,0);
            auVar219 = auVar106 & auVar233;
            if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar219 >> 0x7f,0) != '\0') ||
                  (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0xbf,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar219[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar233,auVar106);
            }
            uVar78 = vmovmskps_avx(auVar106);
            iVar15 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar78 = iVar15 << 2;
            *(undefined4 *)(local_560 + uVar78) = 0;
            aVar1 = (ray->dir).field_0;
            local_7a0._0_16_ = (undefined1  [16])aVar1;
            auVar93 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            _local_b00 = ZEXT416(*(uint *)(local_3e0 + uVar78));
            if (auVar93._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_440 + uVar78));
              fVar85 = sqrtf(auVar93._0_4_);
              fVar114 = (float)local_ac0._0_4_;
              uVar83 = local_ac0._4_4_;
              uVar213 = local_ac0._8_4_;
              uVar214 = local_ac0._12_4_;
            }
            else {
              auVar93 = vsqrtss_avx(auVar93,auVar93);
              fVar85 = auVar93._0_4_;
              fVar114 = *(float *)(local_440 + uVar78);
              uVar83 = 0;
              uVar213 = 0;
              uVar214 = 0;
            }
            local_800._0_4_ = fVar85 * 1.9073486e-06;
            lVar80 = 5;
            do {
              auVar106 = local_ac0;
              fVar85 = 1.0 - fVar114;
              local_ac0._4_4_ = uVar83;
              local_ac0._0_4_ = fVar114;
              local_ac0._8_4_ = uVar213;
              local_ac0._16_16_ = auVar106._16_16_;
              local_ac0._12_4_ = uVar214;
              auVar115._0_4_ = local_a40._0_4_ * fVar114;
              auVar115._4_4_ = local_a40._4_4_ * fVar114;
              auVar115._8_4_ = local_a40._8_4_ * fVar114;
              auVar115._12_4_ = local_a40._12_4_ * fVar114;
              auVar150._4_4_ = fVar85;
              auVar150._0_4_ = fVar85;
              auVar150._8_4_ = fVar85;
              auVar150._12_4_ = fVar85;
              auVar93 = vfmadd231ps_fma(auVar115,auVar150,local_a20);
              auVar167._0_4_ = local_a30._0_4_ * fVar114;
              auVar167._4_4_ = local_a30._4_4_ * fVar114;
              auVar167._8_4_ = local_a30._8_4_ * fVar114;
              auVar167._12_4_ = local_a30._12_4_ * fVar114;
              auVar190 = vfmadd231ps_fma(auVar167,auVar150,local_a40);
              auVar204._0_4_ = fVar114 * auVar190._0_4_;
              auVar204._4_4_ = fVar114 * auVar190._4_4_;
              auVar204._8_4_ = fVar114 * auVar190._8_4_;
              auVar204._12_4_ = fVar114 * auVar190._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar204,auVar150,auVar93);
              auVar116._0_4_ = fVar114 * (float)local_a50._0_4_;
              auVar116._4_4_ = fVar114 * (float)local_a50._4_4_;
              auVar116._8_4_ = fVar114 * fStack_a48;
              auVar116._12_4_ = fVar114 * fStack_a44;
              auVar93 = vfmadd231ps_fma(auVar116,auVar150,local_a30);
              auVar187._0_4_ = fVar114 * auVar93._0_4_;
              auVar187._4_4_ = fVar114 * auVar93._4_4_;
              auVar187._8_4_ = fVar114 * auVar93._8_4_;
              auVar187._12_4_ = fVar114 * auVar93._12_4_;
              auVar190 = vfmadd231ps_fma(auVar187,auVar150,auVar190);
              auVar117._4_4_ = local_b00._0_4_;
              auVar117._0_4_ = local_b00._0_4_;
              auVar117._8_4_ = local_b00._0_4_;
              auVar117._12_4_ = local_b00._0_4_;
              auVar93 = vfmadd213ps_fma(auVar117,local_7a0._0_16_,_DAT_01feba10);
              auVar89._0_4_ = fVar114 * auVar190._0_4_;
              auVar89._4_4_ = fVar114 * auVar190._4_4_;
              auVar89._8_4_ = fVar114 * auVar190._8_4_;
              auVar89._12_4_ = fVar114 * auVar190._12_4_;
              auVar228 = vfmadd231ps_fma(auVar89,local_9c0._0_16_,auVar150);
              local_620._0_16_ = auVar228;
              auVar93 = vsubps_avx(auVar93,auVar228);
              _local_7e0 = auVar93;
              auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
              local_8e0._0_16_ = auVar93;
              if (auVar93._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar85);
                local_a80._0_16_ = auVar190;
                auVar111._0_4_ = sqrtf(auVar93._0_4_);
                auVar111._4_60_ = extraout_var;
                auVar93 = auVar111._0_16_;
                auVar190 = local_a80._0_16_;
                auVar228 = local_ae0._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                auVar228 = ZEXT416((uint)fVar85);
              }
              auVar190 = vsubps_avx(auVar190,local_9c0._0_16_);
              local_9c0._0_4_ = auVar190._0_4_ * 3.0;
              local_9c0._4_4_ = auVar190._4_4_ * 3.0;
              local_9c0._8_4_ = auVar190._8_4_ * 3.0;
              local_9c0._12_4_ = auVar190._12_4_ * 3.0;
              auVar190 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,local_ac0._0_16_);
              auVar121 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_ac0._0_16_,auVar228);
              fVar85 = auVar228._0_4_ * 6.0;
              fVar114 = auVar190._0_4_ * 6.0;
              fVar144 = auVar121._0_4_ * 6.0;
              fVar270 = local_ac0._0_4_ * 6.0;
              auVar168._0_4_ = fVar270 * (float)local_a50._0_4_;
              auVar168._4_4_ = fVar270 * (float)local_a50._4_4_;
              auVar168._8_4_ = fVar270 * fStack_a48;
              auVar168._12_4_ = fVar270 * fStack_a44;
              auVar118._4_4_ = fVar144;
              auVar118._0_4_ = fVar144;
              auVar118._8_4_ = fVar144;
              auVar118._12_4_ = fVar144;
              auVar190 = vfmadd132ps_fma(auVar118,auVar168,local_a30);
              auVar169._4_4_ = fVar114;
              auVar169._0_4_ = fVar114;
              auVar169._8_4_ = fVar114;
              auVar169._12_4_ = fVar114;
              auVar190 = vfmadd132ps_fma(auVar169,auVar190,local_a40);
              auVar228 = vdpps_avx(local_9c0._0_16_,local_9c0._0_16_,0x7f);
              auVar119._4_4_ = fVar85;
              auVar119._0_4_ = fVar85;
              auVar119._8_4_ = fVar85;
              auVar119._12_4_ = fVar85;
              auVar130 = vfmadd132ps_fma(auVar119,auVar190,local_a20);
              auVar190 = vblendps_avx(auVar228,_DAT_01feba10,0xe);
              auVar121 = vrsqrtss_avx(auVar190,auVar190);
              fVar144 = auVar228._0_4_;
              fVar85 = auVar121._0_4_;
              auVar121 = vdpps_avx(local_9c0._0_16_,auVar130,0x7f);
              fVar85 = fVar85 * 1.5 + fVar144 * -0.5 * fVar85 * fVar85 * fVar85;
              auVar120._0_4_ = auVar130._0_4_ * fVar144;
              auVar120._4_4_ = auVar130._4_4_ * fVar144;
              auVar120._8_4_ = auVar130._8_4_ * fVar144;
              auVar120._12_4_ = auVar130._12_4_ * fVar144;
              fVar114 = auVar121._0_4_;
              auVar205._0_4_ = local_9c0._0_4_ * fVar114;
              auVar205._4_4_ = local_9c0._4_4_ * fVar114;
              auVar205._8_4_ = local_9c0._8_4_ * fVar114;
              auVar205._12_4_ = local_9c0._12_4_ * fVar114;
              auVar121 = vsubps_avx(auVar120,auVar205);
              auVar190 = vrcpss_avx(auVar190,auVar190);
              auVar130 = vfnmadd213ss_fma(auVar190,auVar228,ZEXT416(0x40000000));
              fVar114 = auVar190._0_4_ * auVar130._0_4_;
              auVar190 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                    ZEXT416((uint)((float)local_b00._0_4_ * (float)local_800._0_4_))
                                   );
              local_ae0._0_4_ = auVar190._0_4_;
              uVar84 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
              auVar229._0_8_ = uVar84 ^ 0x8000000080000000;
              auVar229._8_4_ = -local_9c0._8_4_;
              auVar229._12_4_ = -local_9c0._12_4_;
              auVar170._0_4_ = fVar85 * auVar121._0_4_ * fVar114;
              auVar170._4_4_ = fVar85 * auVar121._4_4_ * fVar114;
              auVar170._8_4_ = fVar85 * auVar121._8_4_ * fVar114;
              auVar170._12_4_ = fVar85 * auVar121._12_4_ * fVar114;
              local_920._0_4_ = local_9c0._0_4_ * fVar85;
              local_920._4_4_ = local_9c0._4_4_ * fVar85;
              local_920._8_4_ = local_9c0._8_4_ * fVar85;
              local_920._12_4_ = local_9c0._12_4_ * fVar85;
              if (fVar144 < -fVar144) {
                local_a80._0_4_ = auVar93._0_4_;
                local_900._0_16_ = auVar229;
                local_840._0_16_ = auVar170;
                fVar85 = sqrtf(fVar144);
                auVar93 = ZEXT416((uint)local_a80._0_4_);
                auVar170 = local_840._0_16_;
                auVar229 = local_900._0_16_;
              }
              else {
                auVar190 = vsqrtss_avx(auVar228,auVar228);
                fVar85 = auVar190._0_4_;
              }
              auVar234 = ZEXT1664(auVar229);
              local_a80._0_16_ = vdpps_avx(_local_7e0,local_920._0_16_,0x7f);
              auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar93,
                                         ZEXT416((uint)local_ae0._0_4_));
              auVar190 = vdpps_avx(auVar229,local_920._0_16_,0x7f);
              auVar228 = vdpps_avx(_local_7e0,auVar170,0x7f);
              auVar121 = vdpps_avx(local_7a0._0_16_,local_920._0_16_,0x7f);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)(auVar93._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar85)),auVar130);
              local_900._0_4_ = auVar93._0_4_;
              auVar90._0_4_ = local_a80._0_4_ * local_a80._0_4_;
              auVar90._4_4_ = local_a80._4_4_ * local_a80._4_4_;
              auVar90._8_4_ = local_a80._8_4_ * local_a80._8_4_;
              auVar90._12_4_ = local_a80._12_4_ * local_a80._12_4_;
              auVar93 = vdpps_avx(_local_7e0,auVar229,0x7f);
              auVar151 = vsubps_avx(local_8e0._0_16_,auVar90);
              auVar130 = vrsqrtss_avx(auVar151,auVar151);
              fVar114 = auVar151._0_4_;
              fVar85 = auVar130._0_4_;
              fVar85 = fVar85 * 1.5 + fVar114 * -0.5 * fVar85 * fVar85 * fVar85;
              auVar130 = vdpps_avx(_local_7e0,local_7a0._0_16_,0x7f);
              local_920._0_16_ = ZEXT416((uint)(auVar190._0_4_ + auVar228._0_4_));
              auVar93 = vfnmadd231ss_fma(auVar93,local_a80._0_16_,local_920._0_16_);
              auVar190 = vfnmadd231ss_fma(auVar130,local_a80._0_16_,auVar121);
              if (fVar114 < 0.0) {
                local_840._0_16_ = auVar121;
                local_660._0_16_ = auVar93;
                local_680._0_4_ = fVar85;
                _local_6a0 = auVar190;
                auVar234 = ZEXT1664(auVar229);
                fVar114 = sqrtf(fVar114);
                fVar85 = (float)local_680._0_4_;
                auVar190 = _local_6a0;
                auVar121 = local_840._0_16_;
                auVar93 = local_660._0_16_;
              }
              else {
                auVar228 = vsqrtss_avx(auVar151,auVar151);
                fVar114 = auVar228._0_4_;
              }
              auVar227 = ZEXT3264(local_9e0);
              auVar228 = vpermilps_avx(local_620._0_16_,0xff);
              auVar130 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar93 = vfmsub213ss_fma(auVar93,ZEXT416((uint)fVar85),auVar130);
              auVar171._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
              auVar171._8_4_ = auVar121._8_4_ ^ 0x80000000;
              auVar171._12_4_ = auVar121._12_4_ ^ 0x80000000;
              auVar188._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
              auVar188._8_4_ = auVar93._8_4_ ^ 0x80000000;
              auVar188._12_4_ = auVar93._12_4_ ^ 0x80000000;
              auVar151 = ZEXT416((uint)(auVar190._0_4_ * fVar85));
              auVar190 = vfmsub231ss_fma(ZEXT416((uint)(auVar121._0_4_ * auVar93._0_4_)),
                                         local_920._0_16_,auVar151);
              auVar93 = vinsertps_avx(auVar151,auVar171,0x10);
              uVar83 = auVar190._0_4_;
              auVar172._4_4_ = uVar83;
              auVar172._0_4_ = uVar83;
              auVar172._8_4_ = uVar83;
              auVar172._12_4_ = uVar83;
              auVar93 = vdivps_avx(auVar93,auVar172);
              auVar121 = ZEXT416((uint)(fVar114 - auVar228._0_4_));
              auVar228 = vinsertps_avx(local_a80._0_16_,auVar121,0x10);
              auVar152._0_4_ = auVar228._0_4_ * auVar93._0_4_;
              auVar152._4_4_ = auVar228._4_4_ * auVar93._4_4_;
              auVar152._8_4_ = auVar228._8_4_ * auVar93._8_4_;
              auVar152._12_4_ = auVar228._12_4_ * auVar93._12_4_;
              auVar93 = vinsertps_avx(auVar188,local_920._0_16_,0x1c);
              auVar93 = vdivps_avx(auVar93,auVar172);
              auVar190 = vhaddps_avx(auVar152,auVar152);
              auVar173._0_4_ = auVar228._0_4_ * auVar93._0_4_;
              auVar173._4_4_ = auVar228._4_4_ * auVar93._4_4_;
              auVar173._8_4_ = auVar228._8_4_ * auVar93._8_4_;
              auVar173._12_4_ = auVar228._12_4_ * auVar93._12_4_;
              auVar93 = vhaddps_avx(auVar173,auVar173);
              fVar114 = (float)local_ac0._0_4_ - auVar190._0_4_;
              uVar83 = 0;
              uVar213 = 0;
              uVar214 = 0;
              fVar144 = (float)local_b00._0_4_ - auVar93._0_4_;
              _local_b00 = ZEXT416((uint)fVar144);
              auVar93 = vandps_avx(local_a80._0_16_,local_640._0_16_);
              bVar50 = true;
              fVar270 = (float)local_8c0._4_4_;
              fVar149 = fStack_8b8;
              fVar145 = fStack_8b4;
              fVar271 = fStack_8b0;
              fVar146 = fStack_8ac;
              fVar147 = fStack_8a8;
              fVar85 = (float)local_8c0._0_4_;
              if ((float)local_900._0_4_ <= auVar93._0_4_) {
LAB_018c08f6:
                auVar244 = ZEXT3264(local_980);
              }
              else {
                auVar190 = vfmadd231ss_fma(ZEXT416((uint)((float)local_900._0_4_ +
                                                         (float)local_ae0._0_4_)),_local_6c0,
                                           ZEXT416(0x36000000));
                auVar93 = vandps_avx(auVar121,local_640._0_16_);
                if (auVar190._0_4_ <= auVar93._0_4_) goto LAB_018c08f6;
                fVar144 = fVar144 + (float)local_770._0_4_;
                bVar50 = false;
                _local_b00 = ZEXT416((uint)fVar144);
                if (fVar144 < (ray->org).field_0.m128[3]) {
                  unaff_R14B = 0;
                  goto LAB_018c08f6;
                }
                auVar244 = ZEXT3264(local_980);
                if (ray->tfar < fVar144) {
                  unaff_R14B = 0;
                  goto LAB_018c08f6;
                }
                if ((fVar114 < 0.0) || (1.0 < fVar114)) {
LAB_018c091d:
                  bVar50 = false;
                  unaff_R14B = 0;
                }
                else {
                  local_ae0._0_4_ = ray->tfar;
                  auVar93 = vrsqrtss_avx(local_8e0._0_16_,local_8e0._0_16_);
                  fVar272 = auVar93._0_4_;
                  pGVar7 = (context->scene->geometries).items[local_a88].ptr;
                  if ((pGVar7->mask & ray->mask) == 0) goto LAB_018c091d;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_R14B = 1;
                  }
                  else {
                    fVar85 = fVar272 * 1.5 + local_8e0._0_4_ * -0.5 * fVar272 * fVar272 * fVar272;
                    auVar122._0_4_ = fVar85 * (float)local_7e0._0_4_;
                    auVar122._4_4_ = fVar85 * (float)local_7e0._4_4_;
                    auVar122._8_4_ = fVar85 * fStack_7d8;
                    auVar122._12_4_ = fVar85 * fStack_7d4;
                    auVar121 = vfmadd213ps_fma(auVar130,auVar122,local_9c0._0_16_);
                    auVar93 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar190 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                    auVar123._0_4_ = auVar122._0_4_ * auVar190._0_4_;
                    auVar123._4_4_ = auVar122._4_4_ * auVar190._4_4_;
                    auVar123._8_4_ = auVar122._8_4_ * auVar190._8_4_;
                    auVar123._12_4_ = auVar122._12_4_ * auVar190._12_4_;
                    auVar228 = vfmsub231ps_fma(auVar123,local_9c0._0_16_,auVar93);
                    auVar93 = vshufps_avx(auVar228,auVar228,0xc9);
                    auVar190 = vshufps_avx(auVar121,auVar121,0xc9);
                    auVar228 = vshufps_avx(auVar228,auVar228,0xd2);
                    auVar91._0_4_ = auVar121._0_4_ * auVar228._0_4_;
                    auVar91._4_4_ = auVar121._4_4_ * auVar228._4_4_;
                    auVar91._8_4_ = auVar121._8_4_ * auVar228._8_4_;
                    auVar91._12_4_ = auVar121._12_4_ * auVar228._12_4_;
                    auVar190 = vfmsub231ps_fma(auVar91,auVar93,auVar190);
                    auVar93 = vshufps_avx(auVar190,auVar190,0xe9);
                    local_960 = vmovlps_avx(auVar93);
                    local_958 = auVar190._0_4_;
                    local_950 = 0;
                    local_94c = (undefined4)local_928;
                    local_948 = (undefined4)local_a88;
                    local_944 = context->user->instID[0];
                    local_940 = context->user->instPrimID[0];
                    ray->tfar = fVar144;
                    local_b04 = -1;
                    local_a10.valid = &local_b04;
                    local_a10.geometryUserPtr = pGVar7->userPtr;
                    local_a10.context = context->user;
                    local_a10.hit = (RTCHitN *)&local_960;
                    local_a10.N = 1;
                    local_ac0._0_16_ = ZEXT416((uint)fVar114);
                    local_a10.ray = (RTCRayN *)ray;
                    local_954 = fVar114;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018c0aa3:
                      p_Var8 = context->args->filter;
                      fVar144 = (float)local_ae0._0_4_;
                      fVar85 = (float)local_8c0._0_4_;
                      fVar270 = (float)local_8c0._4_4_;
                      fVar149 = fStack_8b8;
                      fVar145 = fStack_8b4;
                      fVar271 = fStack_8b0;
                      fVar146 = fStack_8ac;
                      fVar147 = fStack_8a8;
                      if (p_Var8 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          (*p_Var8)(&local_a10);
                          auVar227 = ZEXT3264(local_9e0);
                          auVar244 = ZEXT3264(local_980);
                          fVar85 = (float)local_8c0._0_4_;
                          fVar270 = (float)local_8c0._4_4_;
                          fVar149 = fStack_8b8;
                          fVar145 = fStack_8b4;
                          fVar271 = fStack_8b0;
                          fVar146 = fStack_8ac;
                          fVar147 = fStack_8a8;
                          fVar114 = (float)local_ac0._0_4_;
                          uVar83 = local_ac0._4_4_;
                          uVar213 = local_ac0._8_4_;
                          uVar214 = local_ac0._12_4_;
                        }
                        fVar144 = (float)local_ae0._0_4_;
                        if (*local_a10.valid == 0) {
                          unaff_R14B = 0;
                          goto LAB_018c0b36;
                        }
                      }
                      unaff_R14B = 1;
                    }
                    else {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      (*pGVar7->occlusionFilterN)(&local_a10);
                      auVar227 = ZEXT3264(local_9e0);
                      auVar244 = ZEXT3264(local_980);
                      fVar114 = (float)local_ac0._0_4_;
                      uVar83 = local_ac0._4_4_;
                      uVar213 = local_ac0._8_4_;
                      uVar214 = local_ac0._12_4_;
                      if (*local_a10.valid != 0) goto LAB_018c0aa3;
                      unaff_R14B = 0;
                      fVar144 = (float)local_ae0._0_4_;
                      fVar85 = (float)local_8c0._0_4_;
                      fVar270 = (float)local_8c0._4_4_;
                      fVar149 = fStack_8b8;
                      fVar145 = fStack_8b4;
                      fVar271 = fStack_8b0;
                      fVar146 = fStack_8ac;
                      fVar147 = fStack_8a8;
                    }
LAB_018c0b36:
                    if (unaff_R14B == 0) {
                      ray->tfar = fVar144;
                    }
                  }
                  bVar50 = false;
                }
              }
              if (!bVar50) goto LAB_018c0b4d;
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            unaff_R14B = 0;
LAB_018c0b4d:
            unaff_R14B = unaff_R14B & 1;
            bVar79 = bVar79 | unaff_R14B;
            fVar114 = ray->tfar;
            auVar107._4_4_ = fVar114;
            auVar107._0_4_ = fVar114;
            auVar107._8_4_ = fVar114;
            auVar107._12_4_ = fVar114;
            auVar107._16_4_ = fVar114;
            auVar107._20_4_ = fVar114;
            auVar107._24_4_ = fVar114;
            auVar107._28_4_ = fVar114;
            auVar233 = vcmpps_avx(_local_700,auVar107,2);
            auVar106 = vandps_avx(auVar233,local_560);
            auVar236 = ZEXT3264(auVar106);
            auVar233 = local_560 & auVar233;
            uVar84 = local_5a0._0_8_;
            auVar219 = local_8a0;
            auVar258 = local_880;
            local_560 = auVar106;
          } while ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar233 >> 0x7f,0) != '\0') ||
                     (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar233 >> 0xbf,0) != '\0') ||
                   (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar233[0x1f] < '\0');
        }
        auVar112._0_4_ = fVar85 * (float)local_600._0_4_;
        auVar112._4_4_ = fVar270 * (float)local_600._4_4_;
        auVar112._8_4_ = fVar149 * fStack_5f8;
        auVar112._12_4_ = fVar145 * fStack_5f4;
        auVar112._16_4_ = fVar271 * fStack_5f0;
        auVar112._20_4_ = fVar146 * fStack_5ec;
        auVar112._28_36_ = auVar236._28_36_;
        auVar112._24_4_ = fVar147 * fStack_5e8;
        auVar93 = vfmadd213ps_fma(local_5e0,auVar219,auVar112._0_32_);
        auVar93 = vfmadd213ps_fma(local_5c0,auVar258,ZEXT1632(auVar93));
        auVar106 = vandps_avx(ZEXT1632(auVar93),local_740);
        auVar139._8_4_ = 0x3e99999a;
        auVar139._0_8_ = 0x3e99999a3e99999a;
        auVar139._12_4_ = 0x3e99999a;
        auVar139._16_4_ = 0x3e99999a;
        auVar139._20_4_ = 0x3e99999a;
        auVar139._24_4_ = 0x3e99999a;
        auVar139._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar139,1);
        auVar233 = vorps_avx(auVar106,local_320);
        auVar140._0_4_ = (float)local_820._0_4_ + (float)local_520._0_4_;
        auVar140._4_4_ = (float)local_820._4_4_ + (float)local_520._4_4_;
        auVar140._8_4_ = fStack_818 + fStack_518;
        auVar140._12_4_ = fStack_814 + fStack_514;
        auVar140._16_4_ = fStack_810 + fStack_510;
        auVar140._20_4_ = fStack_80c + fStack_50c;
        auVar140._24_4_ = fStack_808 + fStack_508;
        auVar140._28_4_ = fStack_804 + fStack_504;
        fVar85 = ray->tfar;
        auVar160._4_4_ = fVar85;
        auVar160._0_4_ = fVar85;
        auVar160._8_4_ = fVar85;
        auVar160._12_4_ = fVar85;
        auVar160._16_4_ = fVar85;
        auVar160._20_4_ = fVar85;
        auVar160._24_4_ = fVar85;
        auVar160._28_4_ = fVar85;
        auVar106 = vcmpps_avx(auVar140,auVar160,2);
        _local_6c0 = vandps_avx(auVar106,local_540);
        auVar141._8_4_ = 3;
        auVar141._0_8_ = 0x300000003;
        auVar141._12_4_ = 3;
        auVar141._16_4_ = 3;
        auVar141._20_4_ = 3;
        auVar141._24_4_ = 3;
        auVar141._28_4_ = 3;
        auVar161._8_4_ = 2;
        auVar161._0_8_ = 0x200000002;
        auVar161._12_4_ = 2;
        auVar161._16_4_ = 2;
        auVar161._20_4_ = 2;
        auVar161._24_4_ = 2;
        auVar161._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar161,auVar141,auVar233);
        _local_700 = vpcmpgtd_avx2(auVar106,local_340);
        auVar106 = vpandn_avx2(_local_700,_local_6c0);
        auVar233 = _local_6c0 & ~_local_700;
        if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar233 >> 0x7f,0) == '\0') &&
              (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar233 >> 0xbf,0) == '\0') &&
            (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar233[0x1f]) {
          auVar236 = ZEXT3264(local_860);
          local_5a0._0_8_ = uVar84;
        }
        else {
          auVar190 = vminps_avx(local_a20,local_a40);
          auVar93 = vmaxps_avx(local_a20,local_a40);
          auVar228 = vminps_avx(local_a30,_local_a50);
          auVar121 = vminps_avx(auVar190,auVar228);
          auVar190 = vmaxps_avx(local_a30,_local_a50);
          auVar228 = vmaxps_avx(auVar93,auVar190);
          local_8a0._8_4_ = 0x7fffffff;
          local_8a0._0_8_ = 0x7fffffff7fffffff;
          local_8a0._12_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar121,local_8a0._0_16_);
          auVar190 = vandps_avx(auVar228,local_8a0._0_16_);
          auVar93 = vmaxps_avx(auVar93,auVar190);
          auVar190 = vmovshdup_avx(auVar93);
          auVar190 = vmaxss_avx(auVar190,auVar93);
          auVar93 = vshufpd_avx(auVar93,auVar93,1);
          auVar93 = vmaxss_avx(auVar93,auVar190);
          local_7c0._0_4_ = auVar93._0_4_ * 1.9073486e-06;
          local_660._0_16_ = vshufps_avx(auVar228,auVar228,0xff);
          local_680 = _local_420;
          local_6a0._4_4_ = (float)local_820._4_4_ + (float)local_420._4_4_;
          local_6a0._0_4_ = (float)local_820._0_4_ + (float)local_420._0_4_;
          fStack_698 = fStack_818 + fStack_418;
          fStack_694 = fStack_814 + fStack_414;
          fStack_690 = fStack_810 + fStack_410;
          fStack_68c = fStack_80c + fStack_40c;
          fStack_688 = fStack_808 + fStack_408;
          fStack_684 = fStack_804 + fStack_404;
          do {
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar233 = vblendvps_avx(auVar142,local_680,auVar106);
            auVar219 = vshufps_avx(auVar233,auVar233,0xb1);
            auVar219 = vminps_avx(auVar233,auVar219);
            auVar12 = vshufpd_avx(auVar219,auVar219,5);
            auVar219 = vminps_avx(auVar219,auVar12);
            auVar12 = vpermpd_avx2(auVar219,0x4e);
            auVar219 = vminps_avx(auVar219,auVar12);
            auVar219 = vcmpps_avx(auVar233,auVar219,0);
            auVar12 = auVar106 & auVar219;
            auVar233 = auVar106;
            if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0x7f,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0xbf,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar12[0x1f] < '\0') {
              auVar233 = vandps_avx(auVar219,auVar106);
            }
            uVar78 = vmovmskps_avx(auVar233);
            iVar15 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar78 = iVar15 << 2;
            local_580 = auVar106;
            *(undefined4 *)(local_580 + uVar78) = 0;
            aVar1 = (ray->dir).field_0;
            local_7a0._0_16_ = (undefined1  [16])aVar1;
            auVar93 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            auVar260 = ZEXT464(*(uint *)(local_460 + uVar78));
            if (auVar93._0_4_ < 0.0) {
              _local_b00 = ZEXT416(*(uint *)(local_460 + uVar78));
              local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_400 + uVar78));
              fVar114 = sqrtf(auVar93._0_4_);
              auVar260 = ZEXT1664(_local_b00);
              fVar85 = (float)local_ac0._0_4_;
              uVar83 = local_ac0._4_4_;
              uVar213 = local_ac0._8_4_;
              uVar214 = local_ac0._12_4_;
            }
            else {
              auVar93 = vsqrtss_avx(auVar93,auVar93);
              fVar114 = auVar93._0_4_;
              fVar85 = *(float *)(local_400 + uVar78);
              uVar83 = 0;
              uVar213 = 0;
              uVar214 = 0;
            }
            local_880._0_4_ = fVar114 * 1.9073486e-06;
            lVar80 = 5;
            do {
              auVar106 = local_ac0;
              fVar144 = auVar260._0_4_;
              fVar114 = 1.0 - fVar144;
              auVar124._0_4_ = local_a40._0_4_ * fVar144;
              auVar124._4_4_ = local_a40._4_4_ * fVar144;
              auVar124._8_4_ = local_a40._8_4_ * fVar144;
              auVar124._12_4_ = local_a40._12_4_ * fVar144;
              auVar153._4_4_ = fVar114;
              auVar153._0_4_ = fVar114;
              auVar153._8_4_ = fVar114;
              auVar153._12_4_ = fVar114;
              auVar93 = vfmadd231ps_fma(auVar124,auVar153,local_a20);
              auVar174._0_4_ = local_a30._0_4_ * fVar144;
              auVar174._4_4_ = local_a30._4_4_ * fVar144;
              auVar174._8_4_ = local_a30._8_4_ * fVar144;
              auVar174._12_4_ = local_a30._12_4_ * fVar144;
              auVar190 = vfmadd231ps_fma(auVar174,auVar153,local_a40);
              auVar206._0_4_ = fVar144 * auVar190._0_4_;
              auVar206._4_4_ = fVar144 * auVar190._4_4_;
              auVar206._8_4_ = fVar144 * auVar190._8_4_;
              auVar206._12_4_ = fVar144 * auVar190._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar206,auVar153,auVar93);
              auVar125._0_4_ = fVar144 * (float)local_a50._0_4_;
              auVar125._4_4_ = fVar144 * (float)local_a50._4_4_;
              auVar125._8_4_ = fVar144 * fStack_a48;
              auVar125._12_4_ = fVar144 * fStack_a44;
              auVar93 = vfmadd231ps_fma(auVar125,auVar153,local_a30);
              auVar189._0_4_ = fVar144 * auVar93._0_4_;
              auVar189._4_4_ = fVar144 * auVar93._4_4_;
              auVar189._8_4_ = fVar144 * auVar93._8_4_;
              auVar189._12_4_ = fVar144 * auVar93._12_4_;
              auVar190 = vfmadd231ps_fma(auVar189,auVar153,auVar190);
              auVar126._4_4_ = fVar85;
              auVar126._0_4_ = fVar85;
              auVar126._8_4_ = fVar85;
              auVar126._12_4_ = fVar85;
              auVar93 = vfmadd213ps_fma(auVar126,local_7a0._0_16_,_DAT_01feba10);
              auVar92._0_4_ = fVar144 * auVar190._0_4_;
              auVar92._4_4_ = fVar144 * auVar190._4_4_;
              auVar92._8_4_ = fVar144 * auVar190._8_4_;
              auVar92._12_4_ = fVar144 * auVar190._12_4_;
              auVar228 = vfmadd231ps_fma(auVar92,local_9c0._0_16_,auVar153);
              local_620._0_16_ = auVar228;
              auVar93 = vsubps_avx(auVar93,auVar228);
              _local_7e0 = auVar93;
              auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
              _local_b00 = auVar260._0_16_;
              local_ac0._4_4_ = uVar83;
              local_ac0._0_4_ = fVar85;
              local_ac0._8_4_ = uVar213;
              local_ac0._16_16_ = auVar106._16_16_;
              local_ac0._12_4_ = uVar214;
              local_8e0._0_16_ = auVar93;
              if (auVar93._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar114);
                local_a80._0_16_ = auVar190;
                auVar113._0_4_ = sqrtf(auVar93._0_4_);
                auVar113._4_60_ = extraout_var_00;
                auVar93 = auVar113._0_16_;
                auVar190 = local_a80._0_16_;
                auVar228 = local_ae0._0_16_;
                auVar121 = _local_b00;
                fVar85 = (float)local_ac0._0_4_;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                auVar228 = ZEXT416((uint)fVar114);
                auVar121 = auVar260._0_16_;
              }
              auVar190 = vsubps_avx(auVar190,local_9c0._0_16_);
              local_9c0._0_4_ = auVar190._0_4_ * 3.0;
              local_9c0._4_4_ = auVar190._4_4_ * 3.0;
              local_9c0._8_4_ = auVar190._8_4_ * 3.0;
              local_9c0._12_4_ = auVar190._12_4_ * 3.0;
              auVar190 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar228,auVar121);
              auVar130 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar121,auVar228);
              fVar114 = auVar228._0_4_ * 6.0;
              fVar144 = auVar190._0_4_ * 6.0;
              fVar270 = auVar130._0_4_ * 6.0;
              fVar149 = auVar121._0_4_ * 6.0;
              auVar175._0_4_ = fVar149 * (float)local_a50._0_4_;
              auVar175._4_4_ = fVar149 * (float)local_a50._4_4_;
              auVar175._8_4_ = fVar149 * fStack_a48;
              auVar175._12_4_ = fVar149 * fStack_a44;
              auVar127._4_4_ = fVar270;
              auVar127._0_4_ = fVar270;
              auVar127._8_4_ = fVar270;
              auVar127._12_4_ = fVar270;
              auVar190 = vfmadd132ps_fma(auVar127,auVar175,local_a30);
              auVar176._4_4_ = fVar144;
              auVar176._0_4_ = fVar144;
              auVar176._8_4_ = fVar144;
              auVar176._12_4_ = fVar144;
              auVar190 = vfmadd132ps_fma(auVar176,auVar190,local_a40);
              auVar228 = vdpps_avx(local_9c0._0_16_,local_9c0._0_16_,0x7f);
              auVar128._4_4_ = fVar114;
              auVar128._0_4_ = fVar114;
              auVar128._8_4_ = fVar114;
              auVar128._12_4_ = fVar114;
              auVar130 = vfmadd132ps_fma(auVar128,auVar190,local_a20);
              auVar190 = vblendps_avx(auVar228,_DAT_01feba10,0xe);
              auVar121 = vrsqrtss_avx(auVar190,auVar190);
              fVar270 = auVar228._0_4_;
              fVar114 = auVar121._0_4_;
              auVar121 = vdpps_avx(local_9c0._0_16_,auVar130,0x7f);
              fVar114 = fVar114 * 1.5 + fVar270 * -0.5 * fVar114 * fVar114 * fVar114;
              auVar129._0_4_ = auVar130._0_4_ * fVar270;
              auVar129._4_4_ = auVar130._4_4_ * fVar270;
              auVar129._8_4_ = auVar130._8_4_ * fVar270;
              auVar129._12_4_ = auVar130._12_4_ * fVar270;
              fVar144 = auVar121._0_4_;
              auVar207._0_4_ = local_9c0._0_4_ * fVar144;
              auVar207._4_4_ = local_9c0._4_4_ * fVar144;
              auVar207._8_4_ = local_9c0._8_4_ * fVar144;
              auVar207._12_4_ = local_9c0._12_4_ * fVar144;
              auVar121 = vsubps_avx(auVar129,auVar207);
              auVar190 = vrcpss_avx(auVar190,auVar190);
              auVar130 = vfnmadd213ss_fma(auVar190,auVar228,ZEXT416(0x40000000));
              fVar144 = auVar190._0_4_ * auVar130._0_4_;
              auVar190 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                    ZEXT416((uint)(fVar85 * (float)local_880._0_4_)));
              local_ae0._0_4_ = auVar190._0_4_;
              uVar84 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
              auVar222._0_8_ = uVar84 ^ 0x8000000080000000;
              auVar222._8_4_ = -local_9c0._8_4_;
              auVar222._12_4_ = -local_9c0._12_4_;
              local_800._0_4_ = fVar114 * auVar121._0_4_ * fVar144;
              local_800._4_4_ = fVar114 * auVar121._4_4_ * fVar144;
              local_800._8_4_ = fVar114 * auVar121._8_4_ * fVar144;
              local_800._12_4_ = fVar114 * auVar121._12_4_ * fVar144;
              local_920._0_4_ = local_9c0._0_4_ * fVar114;
              local_920._4_4_ = local_9c0._4_4_ * fVar114;
              local_920._8_4_ = local_9c0._8_4_ * fVar114;
              local_920._12_4_ = local_9c0._12_4_ * fVar114;
              if (fVar270 < -fVar270) {
                local_a80._0_4_ = auVar93._0_4_;
                local_900._0_16_ = auVar222;
                fVar85 = sqrtf(fVar270);
                auVar93 = ZEXT416((uint)local_a80._0_4_);
                auVar222 = local_900._0_16_;
                auVar190 = local_920._0_16_;
              }
              else {
                auVar190 = vsqrtss_avx(auVar228,auVar228);
                fVar85 = auVar190._0_4_;
                auVar190 = local_920._0_16_;
              }
              auVar234 = ZEXT1664(auVar190);
              local_a80._0_16_ = vdpps_avx(_local_7e0,auVar190,0x7f);
              auVar151 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar93,
                                         ZEXT416((uint)local_ae0._0_4_));
              auVar228 = vdpps_avx(auVar222,auVar190,0x7f);
              auVar121 = vdpps_avx(_local_7e0,local_800._0_16_,0x7f);
              auVar130 = vdpps_avx(local_7a0._0_16_,auVar190,0x7f);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)(auVar93._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar85)),auVar151);
              local_900._0_4_ = auVar93._0_4_;
              auVar94._0_4_ = local_a80._0_4_ * local_a80._0_4_;
              auVar94._4_4_ = local_a80._4_4_ * local_a80._4_4_;
              auVar94._8_4_ = local_a80._8_4_ * local_a80._8_4_;
              auVar94._12_4_ = local_a80._12_4_ * local_a80._12_4_;
              auVar93 = vdpps_avx(_local_7e0,auVar222,0x7f);
              auVar3 = vsubps_avx(local_8e0._0_16_,auVar94);
              auVar151 = vrsqrtss_avx(auVar3,auVar3);
              fVar114 = auVar3._0_4_;
              fVar85 = auVar151._0_4_;
              fVar85 = fVar85 * 1.5 + fVar114 * -0.5 * fVar85 * fVar85 * fVar85;
              auVar151 = vdpps_avx(_local_7e0,local_7a0._0_16_,0x7f);
              local_920._0_16_ = ZEXT416((uint)(auVar228._0_4_ + auVar121._0_4_));
              local_800._0_16_ = vfnmadd231ss_fma(auVar93,local_a80._0_16_,local_920._0_16_);
              auVar93 = vfnmadd231ss_fma(auVar151,local_a80._0_16_,auVar130);
              if (fVar114 < 0.0) {
                _local_8c0 = auVar130;
                local_640._0_4_ = fVar85;
                local_840._0_16_ = auVar93;
                auVar234 = ZEXT1664(auVar190);
                fVar114 = sqrtf(fVar114);
                fVar85 = (float)local_640._0_4_;
                auVar93 = local_840._0_16_;
                auVar130 = _local_8c0;
              }
              else {
                auVar190 = vsqrtss_avx(auVar3,auVar3);
                fVar114 = auVar190._0_4_;
              }
              auVar244 = ZEXT3264(local_980);
              auVar227 = ZEXT3264(local_9e0);
              auVar236 = ZEXT3264(local_860);
              auVar190 = vpermilps_avx(local_620._0_16_,0xff);
              auVar121 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar228 = vfmsub213ss_fma(local_800._0_16_,ZEXT416((uint)fVar85),auVar121);
              auVar177._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
              auVar177._8_4_ = auVar130._8_4_ ^ 0x80000000;
              auVar177._12_4_ = auVar130._12_4_ ^ 0x80000000;
              auVar191._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
              auVar191._8_4_ = auVar228._8_4_ ^ 0x80000000;
              auVar191._12_4_ = auVar228._12_4_ ^ 0x80000000;
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * fVar85));
              auVar228 = vfmsub231ss_fma(ZEXT416((uint)(auVar130._0_4_ * auVar228._0_4_)),
                                         local_920._0_16_,auVar93);
              auVar93 = vinsertps_avx(auVar93,auVar177,0x10);
              uVar83 = auVar228._0_4_;
              auVar178._4_4_ = uVar83;
              auVar178._0_4_ = uVar83;
              auVar178._8_4_ = uVar83;
              auVar178._12_4_ = uVar83;
              auVar93 = vdivps_avx(auVar93,auVar178);
              auVar130 = ZEXT416((uint)(fVar114 - auVar190._0_4_));
              auVar228 = vinsertps_avx(local_a80._0_16_,auVar130,0x10);
              auVar154._0_4_ = auVar228._0_4_ * auVar93._0_4_;
              auVar154._4_4_ = auVar228._4_4_ * auVar93._4_4_;
              auVar154._8_4_ = auVar228._8_4_ * auVar93._8_4_;
              auVar154._12_4_ = auVar228._12_4_ * auVar93._12_4_;
              auVar93 = vinsertps_avx(auVar191,local_920._0_16_,0x1c);
              auVar93 = vdivps_avx(auVar93,auVar178);
              auVar190 = vhaddps_avx(auVar154,auVar154);
              auVar179._0_4_ = auVar228._0_4_ * auVar93._0_4_;
              auVar179._4_4_ = auVar228._4_4_ * auVar93._4_4_;
              auVar179._8_4_ = auVar228._8_4_ * auVar93._8_4_;
              auVar179._12_4_ = auVar228._12_4_ * auVar93._12_4_;
              auVar93 = vhaddps_avx(auVar179,auVar179);
              fVar114 = (float)local_b00._0_4_ - auVar190._0_4_;
              auVar260 = ZEXT464((uint)fVar114);
              fVar85 = (float)local_ac0._0_4_ - auVar93._0_4_;
              uVar83 = 0;
              uVar213 = 0;
              uVar214 = 0;
              auVar93 = vandps_avx(local_a80._0_16_,local_8a0._0_16_);
              bVar50 = true;
              if (auVar93._0_4_ < (float)local_900._0_4_) {
                auVar190 = vfmadd231ss_fma(ZEXT416((uint)((float)local_900._0_4_ +
                                                         (float)local_ae0._0_4_)),local_660._0_16_,
                                           ZEXT416(0x36000000));
                auVar93 = vandps_avx(auVar130,local_8a0._0_16_);
                if (auVar93._0_4_ < auVar190._0_4_) {
                  fVar85 = fVar85 + (float)local_770._0_4_;
                  uVar83 = 0;
                  uVar213 = 0;
                  uVar214 = 0;
                  if (((((ray->org).field_0.m128[3] <= fVar85) && (fVar85 <= ray->tfar)) &&
                      (0.0 <= fVar114)) && (fVar114 <= 1.0)) {
                    auVar93 = vrsqrtss_avx(local_8e0._0_16_,local_8e0._0_16_);
                    fVar144 = auVar93._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_a88].ptr;
                    if ((pGVar7->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R14B = 1;
                      }
                      else {
                        local_ae0._0_4_ = ray->tfar;
                        fVar144 = fVar144 * 1.5 +
                                  local_8e0._0_4_ * -0.5 * fVar144 * fVar144 * fVar144;
                        auVar131._0_4_ = fVar144 * (float)local_7e0._0_4_;
                        auVar131._4_4_ = fVar144 * (float)local_7e0._4_4_;
                        auVar131._8_4_ = fVar144 * fStack_7d8;
                        auVar131._12_4_ = fVar144 * fStack_7d4;
                        auVar121 = vfmadd213ps_fma(auVar121,auVar131,local_9c0._0_16_);
                        auVar93 = vshufps_avx(auVar131,auVar131,0xc9);
                        auVar190 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                        auVar132._0_4_ = auVar131._0_4_ * auVar190._0_4_;
                        auVar132._4_4_ = auVar131._4_4_ * auVar190._4_4_;
                        auVar132._8_4_ = auVar131._8_4_ * auVar190._8_4_;
                        auVar132._12_4_ = auVar131._12_4_ * auVar190._12_4_;
                        auVar228 = vfmsub231ps_fma(auVar132,local_9c0._0_16_,auVar93);
                        auVar93 = vshufps_avx(auVar228,auVar228,0xc9);
                        auVar190 = vshufps_avx(auVar121,auVar121,0xc9);
                        auVar228 = vshufps_avx(auVar228,auVar228,0xd2);
                        auVar95._0_4_ = auVar121._0_4_ * auVar228._0_4_;
                        auVar95._4_4_ = auVar121._4_4_ * auVar228._4_4_;
                        auVar95._8_4_ = auVar121._8_4_ * auVar228._8_4_;
                        auVar95._12_4_ = auVar121._12_4_ * auVar228._12_4_;
                        auVar190 = vfmsub231ps_fma(auVar95,auVar93,auVar190);
                        auVar93 = vshufps_avx(auVar190,auVar190,0xe9);
                        local_960 = vmovlps_avx(auVar93);
                        local_958 = auVar190._0_4_;
                        local_950 = 0;
                        local_94c = (undefined4)local_928;
                        local_948 = (undefined4)local_a88;
                        local_944 = context->user->instID[0];
                        local_940 = context->user->instPrimID[0];
                        ray->tfar = fVar85;
                        local_b04 = -1;
                        local_a10.valid = &local_b04;
                        local_a10.geometryUserPtr = pGVar7->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = (RTCHitN *)&local_960;
                        local_a10.N = 1;
                        _local_b00 = ZEXT416((uint)fVar114);
                        local_ac0._0_16_ = ZEXT416((uint)fVar85);
                        local_a10.ray = (RTCRayN *)ray;
                        local_954 = fVar114;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018c148d:
                          p_Var8 = context->args->filter;
                          fVar114 = (float)local_ae0._0_4_;
                          if (p_Var8 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              (*p_Var8)(&local_a10);
                              auVar260 = ZEXT1664(_local_b00);
                              auVar236 = ZEXT3264(local_860);
                              auVar227 = ZEXT3264(local_9e0);
                              auVar244 = ZEXT3264(local_980);
                              fVar85 = (float)local_ac0._0_4_;
                              uVar83 = local_ac0._4_4_;
                              uVar213 = local_ac0._8_4_;
                              uVar214 = local_ac0._12_4_;
                            }
                            fVar114 = (float)local_ae0._0_4_;
                            if (*local_a10.valid == 0) {
                              unaff_R14B = 0;
                              goto LAB_018c1514;
                            }
                          }
                          unaff_R14B = 1;
                        }
                        else {
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          (*pGVar7->occlusionFilterN)(&local_a10);
                          auVar260 = ZEXT1664(_local_b00);
                          auVar236 = ZEXT3264(local_860);
                          auVar227 = ZEXT3264(local_9e0);
                          auVar244 = ZEXT3264(local_980);
                          fVar85 = (float)local_ac0._0_4_;
                          uVar83 = local_ac0._4_4_;
                          uVar213 = local_ac0._8_4_;
                          uVar214 = local_ac0._12_4_;
                          if (*local_a10.valid != 0) goto LAB_018c148d;
                          unaff_R14B = 0;
                          fVar114 = (float)local_ae0._0_4_;
                        }
LAB_018c1514:
                        if (unaff_R14B == 0) {
                          ray->tfar = fVar114;
                        }
                      }
                      bVar50 = false;
                      goto LAB_018c1300;
                    }
                  }
                  bVar50 = false;
                  unaff_R14B = 0;
                }
              }
LAB_018c1300:
              if (!bVar50) goto LAB_018c152b;
              lVar80 = lVar80 + -1;
            } while (lVar80 != 0);
            unaff_R14B = 0;
LAB_018c152b:
            unaff_R14B = unaff_R14B & 1;
            bVar79 = bVar79 | unaff_R14B;
            fVar85 = ray->tfar;
            auVar108._4_4_ = fVar85;
            auVar108._0_4_ = fVar85;
            auVar108._8_4_ = fVar85;
            auVar108._12_4_ = fVar85;
            auVar108._16_4_ = fVar85;
            auVar108._20_4_ = fVar85;
            auVar108._24_4_ = fVar85;
            auVar108._28_4_ = fVar85;
            auVar233 = vcmpps_avx(_local_6a0,auVar108,2);
            auVar106 = vandps_avx(auVar233,local_580);
            local_580 = local_580 & auVar233;
          } while ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_580 >> 0x7f,0) != '\0') ||
                     (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_580 >> 0xbf,0) != '\0') ||
                   (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_580[0x1f] < '\0');
        }
        auVar143._0_4_ = (float)local_820._0_4_ + local_3e0._0_4_;
        auVar143._4_4_ = (float)local_820._4_4_ + local_3e0._4_4_;
        auVar143._8_4_ = fStack_818 + local_3e0._8_4_;
        auVar143._12_4_ = fStack_814 + local_3e0._12_4_;
        auVar143._16_4_ = fStack_810 + local_3e0._16_4_;
        auVar143._20_4_ = fStack_80c + local_3e0._20_4_;
        auVar143._24_4_ = fStack_808 + local_3e0._24_4_;
        auVar143._28_4_ = fStack_804 + local_3e0._28_4_;
        fVar85 = ray->tfar;
        auVar185._4_4_ = fVar85;
        auVar185._0_4_ = fVar85;
        auVar185._8_4_ = fVar85;
        auVar185._12_4_ = fVar85;
        auVar185._16_4_ = fVar85;
        auVar185._20_4_ = fVar85;
        auVar185._24_4_ = fVar85;
        auVar185._28_4_ = fVar85;
        auVar233 = vcmpps_avx(auVar143,auVar185,2);
        auVar106 = vandps_avx(local_500,local_4e0);
        auVar106 = vandps_avx(auVar233,auVar106);
        auVar195._0_4_ = (float)local_820._0_4_ + local_420._0_4_;
        auVar195._4_4_ = (float)local_820._4_4_ + local_420._4_4_;
        auVar195._8_4_ = fStack_818 + local_420._8_4_;
        auVar195._12_4_ = fStack_814 + local_420._12_4_;
        auVar195._16_4_ = fStack_810 + local_420._16_4_;
        auVar195._20_4_ = fStack_80c + local_420._20_4_;
        auVar195._24_4_ = fStack_808 + local_420._24_4_;
        auVar195._28_4_ = fStack_804 + local_420._28_4_;
        auVar219 = vcmpps_avx(auVar195,auVar185,2);
        auVar233 = vandps_avx(_local_700,_local_6c0);
        auVar233 = vandps_avx(auVar219,auVar233);
        auVar233 = vorps_avx(auVar106,auVar233);
        if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar233 >> 0x7f,0) != '\0') ||
              (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar233 >> 0xbf,0) != '\0') ||
            (auVar233 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar233[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar233;
          auVar106 = vblendvps_avx(_local_420,local_3e0,auVar106);
          *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar106;
          uVar86 = vmovlps_avx(local_760);
          *(undefined8 *)(afStack_140 + uVar82 * 0x18) = uVar86;
          auStack_138[uVar82 * 0x18] = (int)local_5a0._0_8_ + 1;
          uVar82 = (ulong)((int)uVar82 + 1);
        }
      }
      uVar84 = local_5a0._0_8_;
    }
    fVar85 = ray->tfar;
    auVar105._4_4_ = fVar85;
    auVar105._0_4_ = fVar85;
    auVar105._8_4_ = fVar85;
    auVar105._12_4_ = fVar85;
    auVar105._16_4_ = fVar85;
    auVar105._20_4_ = fVar85;
    auVar105._24_4_ = fVar85;
    auVar105._28_4_ = fVar85;
    fVar85 = (float)local_820._0_4_;
    fVar114 = (float)local_820._4_4_;
    fVar144 = fStack_818;
    fVar270 = fStack_814;
    fVar149 = fStack_810;
    fVar145 = fStack_80c;
    fVar271 = fStack_808;
    fVar146 = fStack_804;
    do {
      uVar78 = (uint)uVar82;
      if (uVar78 == 0) {
        if (bVar79 != 0) {
          return local_b11;
        }
        fVar85 = ray->tfar;
        auVar110._4_4_ = fVar85;
        auVar110._0_4_ = fVar85;
        auVar110._8_4_ = fVar85;
        auVar110._12_4_ = fVar85;
        auVar110._16_4_ = fVar85;
        auVar110._20_4_ = fVar85;
        auVar110._24_4_ = fVar85;
        auVar110._28_4_ = fVar85;
        auVar106 = vcmpps_avx(local_300,auVar110,2);
        uVar78 = vmovmskps_avx(auVar106);
        uVar78 = (uint)local_748 & uVar78;
        local_b11 = uVar78 != 0;
        if (!local_b11) {
          return local_b11;
        }
        goto LAB_018bf164;
      }
      uVar82 = (ulong)(uVar78 - 1);
      lVar80 = uVar82 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar134._0_4_ = fVar85 + auVar106._0_4_;
      auVar134._4_4_ = fVar114 + auVar106._4_4_;
      auVar134._8_4_ = fVar144 + auVar106._8_4_;
      auVar134._12_4_ = fVar270 + auVar106._12_4_;
      auVar134._16_4_ = fVar149 + auVar106._16_4_;
      auVar134._20_4_ = fVar145 + auVar106._20_4_;
      auVar134._24_4_ = fVar271 + auVar106._24_4_;
      auVar134._28_4_ = fVar146 + auVar106._28_4_;
      auVar219 = vcmpps_avx(auVar134,auVar105,2);
      auVar233 = vandps_avx(auVar219,*(undefined1 (*) [32])(auStack_180 + lVar80));
      local_3e0 = auVar233;
      auVar219 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar219;
      bVar72 = (auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar73 = (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar71 = (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar70 = SUB321(auVar219 >> 0x7f,0) == '\0';
      bVar69 = (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar68 = SUB321(auVar219 >> 0xbf,0) == '\0';
      bVar64 = (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar50 = -1 < auVar219[0x1f];
      if (((((((!bVar72 || !bVar73) || !bVar71) || !bVar70) || !bVar69) || !bVar68) || !bVar64) ||
          !bVar50) {
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar182,auVar106,auVar233);
        auVar219 = vshufps_avx(auVar106,auVar106,0xb1);
        auVar219 = vminps_avx(auVar106,auVar219);
        auVar12 = vshufpd_avx(auVar219,auVar219,5);
        auVar219 = vminps_avx(auVar219,auVar12);
        auVar12 = vpermpd_avx2(auVar219,0x4e);
        auVar219 = vminps_avx(auVar219,auVar12);
        auVar106 = vcmpps_avx(auVar106,auVar219,0);
        auVar219 = auVar233 & auVar106;
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0x7f,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0xbf,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar219[0x1f] < '\0') {
          auVar233 = vandps_avx(auVar106,auVar233);
        }
        fVar85 = afStack_140[uVar82 * 0x18 + 1];
        uVar84 = (ulong)auStack_138[uVar82 * 0x18];
        uVar81 = vmovmskps_avx(auVar233);
        iVar15 = 0;
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
          iVar15 = iVar15 + 1;
        }
        fVar114 = afStack_140[uVar82 * 0x18];
        auVar135._4_4_ = fVar114;
        auVar135._0_4_ = fVar114;
        auVar135._8_4_ = fVar114;
        auVar135._12_4_ = fVar114;
        auVar135._16_4_ = fVar114;
        auVar135._20_4_ = fVar114;
        auVar135._24_4_ = fVar114;
        auVar135._28_4_ = fVar114;
        *(undefined4 *)(local_3e0 + (uint)(iVar15 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar80) = local_3e0;
        uVar81 = uVar78 - 1;
        if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3e0 >> 0x7f,0) != '\0') ||
              (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3e0 >> 0xbf,0) != '\0') ||
            (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3e0[0x1f] < '\0') {
          uVar81 = uVar78;
        }
        fVar85 = fVar85 - fVar114;
        auVar156._4_4_ = fVar85;
        auVar156._0_4_ = fVar85;
        auVar156._8_4_ = fVar85;
        auVar156._12_4_ = fVar85;
        auVar156._16_4_ = fVar85;
        auVar156._20_4_ = fVar85;
        auVar156._24_4_ = fVar85;
        auVar156._28_4_ = fVar85;
        auVar93 = vfmadd132ps_fma(auVar156,auVar135,_DAT_02020f20);
        _local_420 = ZEXT1632(auVar93);
        local_760._8_8_ = 0;
        local_760._0_8_ = *(ulong *)(local_420 + (uint)(iVar15 << 2));
        uVar82 = (ulong)uVar81;
      }
      fVar85 = (float)local_820._0_4_;
      fVar114 = (float)local_820._4_4_;
      fVar144 = fStack_818;
      fVar270 = fStack_814;
      fVar149 = fStack_810;
      fVar145 = fStack_80c;
      fVar271 = fStack_808;
      fVar146 = fStack_804;
    } while (((((((bVar72 && bVar73) && bVar71) && bVar70) && bVar69) && bVar68) && bVar64) &&
             bVar50);
    auVar243 = auVar244._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }